

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  uint uVar40;
  float *pfVar41;
  Mat *in_RCX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  int n_5;
  int n_4;
  int n_3;
  float o1 [2];
  float o0 [2];
  float d3 [2];
  float d2 [2];
  float d1 [2];
  float d0 [2];
  float w1 [4];
  float w0 [4];
  float s3 [4];
  float s2 [4];
  float s1 [4];
  float s0 [4];
  float *out_tile;
  int i_3;
  float *outRow1;
  float *outRow0;
  int j_1;
  float bias0;
  Mat out;
  Mat out_tm;
  int p_2;
  int nRowBlocks_2;
  int nColBlocks_2;
  int h_tm_2;
  int w_tm_2;
  Mat top_blob_bordered;
  int n_2;
  int n_1;
  float *k0_3;
  float *r0_4;
  int n;
  float *k3_2;
  float *k2_2;
  float *k1_2;
  float *k0_2;
  float *r3_2;
  float *r2_2;
  float *r1_2;
  float *r0_3;
  int q_2;
  float sum0 [16];
  float *output0_tm_1;
  int i_2;
  Mat kernel0_tm_1;
  Mat out0_tm_1;
  int p_1;
  __m256 _k3n_1;
  __m256 _k3_1;
  __m256 _k2n_1;
  __m256 _k2_1;
  __m256 _k1n_1;
  __m256 _k1_1;
  __m256 _k0n_1;
  __m256 _k0_1;
  __m256 _r0n_1;
  __m256 _r0_1;
  float *k3_1;
  float *k2_1;
  float *k1_1;
  float *k0_1;
  float *r0_2;
  __m256 _k3n;
  __m256 _k3;
  __m256 _k2n;
  __m256 _k2;
  __m256 _k1n;
  __m256 _k1;
  __m256 _k0n;
  __m256 _k0;
  __m256 _r0n;
  __m256 _r0;
  float *k3;
  float *k2;
  float *k1;
  float *k0;
  float *r3_1;
  float *r2_1;
  float *r1_1;
  float *r0_1;
  int q_1;
  __m256 _sum3n;
  __m256 _sum3;
  __m256 _sum2n;
  __m256 _sum2;
  __m256 _sum1n;
  __m256 _sum1;
  __m256 _sum0n;
  __m256 _sum0;
  float zero_val;
  float *output3_tm;
  float *output2_tm;
  float *output1_tm;
  float *output0_tm;
  int i_1;
  Mat kernel3_tm;
  Mat kernel2_tm;
  Mat kernel1_tm;
  Mat kernel0_tm;
  Mat out3_tm;
  Mat out2_tm;
  Mat out1_tm;
  Mat out0_tm;
  int p;
  int pp;
  int remain_outch_start;
  int nn_outch;
  int tiles_1;
  int nRowBlocks_1;
  int nColBlocks_1;
  int h_tm_1;
  int w_tm_1;
  Mat top_blob_tm;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _d3;
  __m128 _d2;
  __m128 _d1;
  __m128 _d0;
  int i;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  int j;
  float *out_tm0;
  float *img;
  int q;
  int tiles;
  int nRowBlocks;
  int nColBlocks;
  int h_tm;
  int w_tm;
  Mat bottom_blob_tm;
  float *bias;
  Option opt_b;
  Mat bottom_blob_bordered;
  int outch;
  int outh;
  int outw;
  int inch;
  int h;
  int w;
  Mat *in_stack_ffffffffffffbde0;
  Mat *in_stack_ffffffffffffbde8;
  Mat *m;
  Mat *in_stack_ffffffffffffbdf0;
  int in_stack_ffffffffffffbdfc;
  float *in_stack_ffffffffffffbe00;
  Mat *in_stack_ffffffffffffbe08;
  int _c;
  Mat *in_stack_ffffffffffffbe10;
  undefined8 in_stack_ffffffffffffbe18;
  Mat *in_stack_ffffffffffffbe20;
  float *in_stack_ffffffffffffbe28;
  Mat *in_stack_ffffffffffffbe30;
  Mat *in_stack_ffffffffffffbe38;
  float in_stack_ffffffffffffbe48;
  float in_stack_ffffffffffffbe4c;
  undefined4 in_stack_ffffffffffffbe50;
  undefined4 in_stack_ffffffffffffbe54;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 local_3c30;
  undefined8 uStack_3c28;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 local_3c10;
  undefined8 uStack_3c08;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 local_3bf0;
  undefined8 uStack_3be8;
  int local_3bbc;
  int local_3bb8;
  int local_3bb4;
  float local_3bb0 [4];
  undefined4 local_3ba0;
  undefined4 local_3b9c;
  undefined4 local_3b98;
  undefined4 local_3b94;
  undefined4 local_3b90;
  undefined4 local_3b8c;
  float local_3b88;
  undefined4 local_3b84;
  float local_3b80 [4];
  float local_3b70 [4];
  float afStack_3b60 [4];
  float afStack_3b50 [4];
  float afStack_3b40 [4];
  float afStack_3b30 [4];
  float *local_3b20;
  int local_3b14;
  float *local_3b10;
  float *local_3b08;
  int local_3b00;
  float local_3afc;
  Mat local_3af8;
  Mat local_3ab0;
  int local_3a64;
  int local_3a60;
  int local_3a5c;
  int local_3a58;
  int local_3a54;
  Mat local_3a50;
  Mat local_3a08;
  int local_39c0;
  int local_39bc;
  float *local_39b8;
  Mat local_39b0;
  float *local_3968;
  int local_395c;
  float *local_3958;
  float *local_3950;
  float *local_3948;
  float *local_3940;
  Mat local_3938;
  Mat *local_38f0;
  Mat local_38e8;
  float *local_38a0;
  Mat local_3898;
  float *local_3850;
  Mat local_3848;
  Mat *local_3800;
  int local_37f4;
  float local_37f0 [18];
  float *local_37a8;
  int local_379c;
  Mat local_3798;
  Mat local_3750;
  int local_3704;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  float *local_35b0;
  float *local_35a8;
  float *local_35a0;
  float *local_3598;
  Mat local_3590;
  float *local_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  float *local_33e8;
  float *local_33e0;
  float *local_33d8;
  float *local_33d0;
  Mat local_33c8;
  float *local_3380;
  Mat local_3378;
  float *local_3330;
  Mat local_3328;
  float *local_32e0;
  Mat local_32d8;
  float *local_3290;
  int local_3284;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined4 local_3174;
  float *local_3170;
  float *local_3168;
  float *local_3160;
  float *local_3158;
  int local_314c;
  Mat local_3148;
  Mat local_3100;
  Mat local_30b8;
  Mat local_3070;
  Mat local_3028;
  Mat local_2fe0;
  Mat local_2f98;
  Mat local_2f50;
  int local_2f04;
  int local_2f00;
  int local_2efc;
  int local_2ef8;
  int local_2ef4;
  int local_2ef0;
  int local_2eec;
  uint local_2ee8;
  uint local_2ee4;
  Mat local_2ee0;
  Mat local_2e98;
  undefined8 local_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 local_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined1 local_2e10 [16];
  undefined1 local_2e00 [16];
  undefined1 local_2df0 [8];
  undefined8 uStack_2de8;
  undefined1 local_2de0 [16];
  undefined1 local_2dd0 [16];
  undefined1 local_2dc0 [16];
  undefined8 local_2db0;
  undefined8 uStack_2da8;
  undefined1 local_2da0 [16];
  int local_2d84;
  undefined1 (*local_2d80) [16];
  undefined1 (*local_2d78) [16];
  undefined1 (*local_2d70) [16];
  undefined1 (*local_2d68) [16];
  int local_2d5c;
  Mat local_2d58;
  float *local_2d10;
  Mat local_2d08;
  float *local_2cc0;
  int local_2cb8;
  int local_2cb4;
  int local_2cb0;
  int local_2cac;
  uint local_2ca8;
  uint local_2ca4;
  Mat local_2ca0;
  float *local_2c58;
  Mat local_2c40 [2];
  int local_2bb0;
  uint local_2bac;
  uint local_2ba8;
  int local_2ba4;
  int local_2ba0;
  int local_2b9c;
  undefined8 *local_2b98;
  Mat *local_2b90;
  long local_2b80;
  float *local_2b70;
  float *local_2b68;
  float *local_2b60;
  float *local_2b58;
  float *local_2b50;
  float *local_2b48;
  float *local_2b40;
  float *local_2b38;
  float *local_2b30;
  float *local_2b28;
  float *local_2b20;
  float *local_2b18;
  float *local_2b10;
  float *local_2b08;
  float *local_2b00;
  float *local_2af8;
  float *local_2af0;
  float *local_2ae8;
  float *local_2ae0;
  float *local_2ad8;
  float *local_2ad0;
  float *local_2ac8;
  float *local_2ac0;
  float *local_2ab8;
  float *local_2ab0;
  float *local_2aa8;
  float *local_2aa0;
  float *local_2a98;
  float *local_2a90;
  float *local_2a88;
  float *local_2a80;
  float *local_2a78;
  float *local_2a70;
  float *local_2a68;
  float *local_2a60;
  float *local_2a58;
  float *local_2a50;
  float *local_2a48;
  float *local_2a40;
  float *local_2a38;
  float *local_2a30;
  float *local_2a28;
  float *local_2a20;
  float *local_2a18;
  float *local_2a10;
  float *local_2a08;
  float *local_2a00;
  float *local_29f8;
  float *local_29f0;
  float *local_29e8;
  undefined4 local_29e0;
  undefined4 uStack_29dc;
  undefined4 uStack_29d8;
  undefined4 uStack_29d4;
  undefined4 uStack_29d0;
  undefined4 uStack_29cc;
  undefined4 uStack_29c8;
  undefined4 uStack_29c4;
  undefined4 local_29ac;
  undefined4 *local_29a8;
  undefined4 local_29a0;
  undefined4 uStack_299c;
  undefined4 uStack_2998;
  undefined4 uStack_2994;
  undefined4 uStack_2990;
  undefined4 uStack_298c;
  undefined4 uStack_2988;
  undefined4 uStack_2984;
  undefined4 local_296c;
  undefined4 *local_2968;
  undefined4 local_2960;
  undefined4 uStack_295c;
  undefined4 uStack_2958;
  undefined4 uStack_2954;
  undefined4 uStack_2950;
  undefined4 uStack_294c;
  undefined4 uStack_2948;
  undefined4 uStack_2944;
  undefined4 local_292c;
  undefined4 *local_2928;
  undefined4 local_2920;
  undefined4 uStack_291c;
  undefined4 uStack_2918;
  undefined4 uStack_2914;
  undefined4 uStack_2910;
  undefined4 uStack_290c;
  undefined4 uStack_2908;
  undefined4 uStack_2904;
  undefined4 local_28ec;
  undefined4 *local_28e8;
  undefined4 local_28e0;
  undefined4 uStack_28dc;
  undefined4 uStack_28d8;
  undefined4 uStack_28d4;
  undefined4 uStack_28d0;
  undefined4 uStack_28cc;
  undefined4 uStack_28c8;
  undefined4 uStack_28c4;
  undefined4 local_28ac;
  undefined4 *local_28a8;
  undefined4 local_28a0;
  undefined4 uStack_289c;
  undefined4 uStack_2898;
  undefined4 uStack_2894;
  undefined4 uStack_2890;
  undefined4 uStack_288c;
  undefined4 uStack_2888;
  undefined4 uStack_2884;
  undefined4 local_286c;
  undefined4 *local_2868;
  undefined4 local_2860;
  undefined4 uStack_285c;
  undefined4 uStack_2858;
  undefined4 uStack_2854;
  undefined4 uStack_2850;
  undefined4 uStack_284c;
  undefined4 uStack_2848;
  undefined4 uStack_2844;
  undefined4 local_282c;
  undefined4 *local_2828;
  undefined4 local_2820;
  undefined4 uStack_281c;
  undefined4 uStack_2818;
  undefined4 uStack_2814;
  undefined4 uStack_2810;
  undefined4 uStack_280c;
  undefined4 uStack_2808;
  undefined4 uStack_2804;
  undefined4 local_27ec;
  undefined4 *local_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 (*local_27a8) [32];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  float *local_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  float *local_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  float *local_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  float *local_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  float *local_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  float *local_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  float *local_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  float local_16c0;
  float fStack_16bc;
  float fStack_16b8;
  float fStack_16b4;
  float fStack_16b0;
  float fStack_16ac;
  float fStack_16a8;
  float fStack_16a4;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  float local_1680;
  float fStack_167c;
  float fStack_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  float fStack_1668;
  float fStack_1664;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  float local_1600;
  float fStack_15fc;
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  float fStack_15e4;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float fStack_1564;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float fStack_1324;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  float fStack_1064;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  float fStack_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float fStack_f24;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float fStack_ee4;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  float local_e00;
  float fStack_dfc;
  float fStack_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float fStack_de8;
  float fStack_de4;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  float local_dc0;
  float fStack_dbc;
  float fStack_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float fStack_da8;
  float fStack_da4;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  float local_d80;
  float fStack_d7c;
  float fStack_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float fStack_d68;
  float fStack_d64;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 (*local_2d0) [16];
  undefined1 (*local_2c8) [16];
  undefined1 (*local_2c0) [16];
  undefined1 (*local_2b8) [16];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined1 (*local_298) [16];
  undefined8 local_290;
  undefined8 uStack_288;
  float *local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  float *local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  float *local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  fVar42 = (float)((ulong)in_stack_ffffffffffffbe18 >> 0x20);
  local_2b9c = *(undefined4 *)(in_RDI + 0x2c);
  local_2ba0 = *(undefined4 *)(in_RDI + 0x30);
  local_2ba4 = *(int *)(in_RDI + 0x38);
  local_2ba8 = *(int *)(in_RSI + 0x2c);
  local_2bac = *(int *)(in_RSI + 0x30);
  local_2bb0 = *(int *)(in_RSI + 0x38);
  local_2b98 = in_R8;
  local_2b90 = in_RCX;
  local_2b80 = in_RSI;
  Mat::Mat(in_stack_ffffffffffffbde8,in_stack_ffffffffffffbde0);
  local_2ba8 = (local_2ba8 + 1) - ((int)(local_2ba8 + 1) >> 0x1f) & 0xfffffffe;
  local_2bac = (local_2bac + 1) - ((int)(local_2bac + 1) >> 0x1f) & 0xfffffffe;
  local_2b9c = local_2ba8 + 2;
  local_2ba0 = local_2bac + 2;
  local_2c40[0].data = (void *)*local_2b98;
  local_2c40[0].elemsize = local_2b98[2];
  local_2c40[0]._24_8_ = local_2b98[3];
  local_2c40[0].allocator = (Allocator *)local_2b98[4];
  local_2c40[0]._40_8_ = local_2b98[5];
  local_2c40[0]._48_8_ = local_2b98[6];
  local_2c40[0]._56_8_ = local_2b98[7];
  local_2c40[0].refcount = (int *)local_2b98[2];
  m = local_2c40;
  copy_make_border(in_stack_ffffffffffffbe38,in_stack_ffffffffffffbe30,
                   (int)((ulong)in_stack_ffffffffffffbe28 >> 0x20),(int)in_stack_ffffffffffffbe28,
                   (int)((ulong)in_stack_ffffffffffffbe20 >> 0x20),(int)in_stack_ffffffffffffbe20,
                   (int)in_stack_ffffffffffffbe48,fVar42,
                   (Option *)CONCAT44(in_stack_ffffffffffffbe54,in_stack_ffffffffffffbe50));
  local_2c58 = Mat::operator_cast_to_float_(local_2b90);
  Mat::Mat(&local_2ca0);
  local_2ca4 = (local_2ba8 - ((int)local_2ba8 >> 0x1f)) * 2 & 0xfffffffc;
  local_2ca8 = (local_2bac - ((int)local_2bac >> 0x1f)) * 2 & 0xfffffffc;
  uVar40 = local_2ca8;
  if ((int)local_2ca8 < 0) {
    uVar40 = local_2ca8 + 3;
  }
  local_2cac = (int)uVar40 >> 2;
  uVar40 = local_2ca4;
  if ((int)local_2ca4 < 0) {
    uVar40 = local_2ca4 + 3;
  }
  local_2cb0 = (int)uVar40 >> 2;
  local_2cb4 = local_2cac * local_2cb0;
  Mat::create(in_stack_ffffffffffffbe08,(int)((ulong)in_stack_ffffffffffffbe00 >> 0x20),
              (int)in_stack_ffffffffffffbe00,in_stack_ffffffffffffbdfc,
              (size_t)in_stack_ffffffffffffbdf0,(Allocator *)m);
  for (local_2cb8 = 0; local_2cb8 < local_2ba4; local_2cb8 = local_2cb8 + 1) {
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    pfVar41 = Mat::operator_cast_to_float_(&local_2d08);
    Mat::~Mat((Mat *)0x343fa9);
    local_2cc0 = pfVar41;
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    pfVar41 = Mat::operator_cast_to_float_(&local_2d58);
    Mat::~Mat((Mat *)0x343ffb);
    local_2d10 = pfVar41;
    for (local_2d5c = 0; local_2d5c < local_2cac; local_2d5c = local_2d5c + 1) {
      local_2d68 = (undefined1 (*) [16])(local_2cc0 + local_2b9c * local_2d5c * 2);
      local_2d70 = (undefined1 (*) [16])(*local_2d68 + (long)local_2b9c * 4);
      local_2d78 = (undefined1 (*) [16])(*local_2d70 + (long)local_2b9c * 4);
      local_2d80 = (undefined1 (*) [16])(*local_2d78 + (long)local_2b9c * 4);
      for (local_2d84 = 0; local_2d84 < local_2cb0; local_2d84 = local_2d84 + 1) {
        local_2b8 = local_2d68;
        local_100 = *(undefined8 *)*local_2d68;
        uStack_f8 = *(undefined8 *)(*local_2d68 + 8);
        local_2c0 = local_2d70;
        local_150 = *(undefined8 *)*local_2d70;
        uStack_148 = *(undefined8 *)(*local_2d70 + 8);
        local_2c8 = local_2d78;
        local_120 = *(undefined8 *)*local_2d78;
        uStack_118 = *(undefined8 *)(*local_2d78 + 8);
        local_2d0 = local_2d80;
        local_140 = *(undefined8 *)*local_2d80;
        uStack_138 = *(undefined8 *)(*local_2d80 + 8);
        auVar1 = vsubps_avx(*local_2d68,*local_2d78);
        local_200._0_4_ = (float)local_150;
        local_200._4_4_ = (float)((ulong)local_150 >> 0x20);
        uStack_1f8._0_4_ = (float)uStack_148;
        uStack_1f8._4_4_ = (float)((ulong)uStack_148 >> 0x20);
        local_210._0_4_ = (float)local_120;
        local_210._4_4_ = (float)((ulong)local_120 >> 0x20);
        uStack_208._0_4_ = (float)uStack_118;
        uStack_208._4_4_ = (float)((ulong)uStack_118 >> 0x20);
        local_2df0._4_4_ = local_200._4_4_ + local_210._4_4_;
        local_2df0._0_4_ = (float)local_200 + (float)local_210;
        uStack_2de8._0_4_ = (float)uStack_1f8 + (float)uStack_208;
        uStack_2de8._4_4_ = uStack_1f8._4_4_ + uStack_208._4_4_;
        auVar2 = vsubps_avx(*local_2d78,*local_2d70);
        auVar3 = vsubps_avx(*local_2d80,*local_2d70);
        local_2de0._0_8_ = auVar1._0_8_;
        local_c0 = local_2de0._0_8_;
        local_2de0._8_8_ = auVar1._8_8_;
        uStack_b8 = local_2de0._8_8_;
        local_d0 = local_2df0;
        uStack_c8 = uStack_2de8;
        auVar4._8_8_ = uStack_2de8;
        auVar4._0_8_ = local_2df0;
        auVar4 = vunpcklps_avx(auVar1,auVar4);
        local_3bf0 = auVar4._0_8_;
        local_2e50 = local_3bf0;
        uStack_3be8 = auVar4._8_8_;
        uStack_2e48 = uStack_3be8;
        local_2e00._0_8_ = auVar2._0_8_;
        local_e0 = local_2e00._0_8_;
        local_2e00._8_8_ = auVar2._8_8_;
        uStack_d8 = local_2e00._8_8_;
        local_2e10._0_8_ = auVar3._0_8_;
        local_f0 = local_2e10._0_8_;
        local_2e10._8_8_ = auVar3._8_8_;
        uStack_e8 = local_2e10._8_8_;
        auVar5 = vunpcklps_avx(auVar2,auVar3);
        local_3c00 = auVar5._0_8_;
        local_2e30 = local_3c00;
        uStack_3bf8 = auVar5._8_8_;
        uStack_2e28 = uStack_3bf8;
        local_80 = local_2de0._0_8_;
        uStack_78 = local_2de0._8_8_;
        local_90 = local_2df0;
        uStack_88 = uStack_2de8;
        auVar39._8_8_ = uStack_2de8;
        auVar39._0_8_ = local_2df0;
        auVar1 = vunpckhps_avx(auVar1,auVar39);
        local_3c10 = auVar1._0_8_;
        local_2e40 = local_3c10;
        uStack_3c08 = auVar1._8_8_;
        uStack_2e38 = uStack_3c08;
        local_a0 = local_2e00._0_8_;
        uStack_98 = local_2e00._8_8_;
        local_b0 = local_2e10._0_8_;
        uStack_a8 = local_2e10._8_8_;
        auVar2 = vunpckhps_avx(auVar2,auVar3);
        local_3c20 = auVar2._0_8_;
        local_2e20 = local_3c20;
        uStack_3c18 = auVar2._8_8_;
        uStack_2e18 = uStack_3c18;
        local_40 = local_3bf0;
        uStack_38 = uStack_3be8;
        local_50 = local_3c00;
        uStack_48 = uStack_3bf8;
        local_2de0 = vunpcklpd_avx(auVar4,auVar5);
        local_3c30 = local_2de0._0_8_;
        uStack_3c28 = local_2de0._8_8_;
        local_1c0 = local_3c00;
        uStack_1b8 = uStack_3bf8;
        local_1d0 = local_3bf0;
        uStack_1c8 = uStack_3be8;
        _local_2df0 = vunpckhpd_avx(auVar4,auVar5);
        local_60 = local_3c10;
        uStack_58 = uStack_3c08;
        local_70 = local_3c20;
        uStack_68 = uStack_3c18;
        local_2e00 = vunpcklpd_avx(auVar1,auVar2);
        local_3c40 = local_2e00._0_8_;
        uStack_3c38 = local_2e00._8_8_;
        local_1e0 = local_3c20;
        uStack_1d8 = uStack_3c18;
        local_1f0 = local_3c10;
        uStack_1e8 = uStack_3c08;
        local_2e10 = vunpckhpd_avx(auVar1,auVar2);
        local_160 = local_3c30;
        uStack_158 = uStack_3c28;
        local_170 = local_3c40;
        uStack_168 = uStack_3c38;
        local_2da0 = vsubps_avx(local_2de0,local_2e00);
        local_220._0_4_ = local_2df0._0_4_;
        local_220._4_4_ = local_2df0._4_4_;
        uStack_218._0_4_ = local_2df0._8_4_;
        uStack_218._4_4_ = local_2df0._12_4_;
        local_230._0_4_ = local_2e00._0_4_;
        local_230._4_4_ = local_2e00._4_4_;
        uStack_228._0_4_ = local_2e00._8_4_;
        uStack_228._4_4_ = local_2e00._12_4_;
        local_2db0 = CONCAT44(local_220._4_4_ + local_230._4_4_,(float)local_220 + (float)local_230)
        ;
        uStack_2da8 = CONCAT44(uStack_218._4_4_ + uStack_228._4_4_,
                               (float)uStack_218 + (float)uStack_228);
        local_180 = local_3c40;
        uStack_178 = uStack_3c38;
        local_190 = local_2df0;
        uStack_188 = uStack_2de8;
        local_2dc0 = vsubps_avx(local_2e00,_local_2df0);
        local_1a0 = local_2e10._0_8_;
        uStack_198 = local_2e10._8_8_;
        local_1b0 = local_2df0;
        uStack_1a8 = uStack_2de8;
        local_2dd0 = vsubps_avx(local_2e10,_local_2df0);
        local_238 = local_2d10;
        local_250 = local_2da0._0_8_;
        uStack_248 = local_2da0._8_8_;
        *(undefined8 *)local_2d10 = local_2da0._0_8_;
        *(undefined8 *)(local_2d10 + 2) = local_2da0._8_8_;
        local_258 = local_2d10 + 4;
        local_270 = local_2db0;
        uStack_268 = uStack_2da8;
        *(undefined8 *)local_258 = local_2db0;
        *(undefined8 *)(local_2d10 + 6) = uStack_2da8;
        local_278 = local_2d10 + 8;
        local_290 = local_2dc0._0_8_;
        uStack_288 = local_2dc0._8_8_;
        *(undefined8 *)local_278 = local_2dc0._0_8_;
        *(undefined8 *)(local_2d10 + 10) = local_2dc0._8_8_;
        local_298 = (undefined1 (*) [16])(local_2d10 + 0xc);
        local_2b0 = local_2dd0._0_8_;
        uStack_2a8 = local_2dd0._8_8_;
        *local_298 = local_2dd0;
        local_2d68 = (undefined1 (*) [16])(*local_2d68 + 8);
        local_2d70 = (undefined1 (*) [16])(*local_2d70 + 8);
        local_2d78 = (undefined1 (*) [16])(*local_2d78 + 8);
        local_2d80 = (undefined1 (*) [16])(*local_2d80 + 8);
        local_2d10 = local_2d10 + 0x10;
        local_230 = local_3c40;
        uStack_228 = uStack_3c38;
        local_220 = local_2df0;
        uStack_218 = uStack_2de8;
        local_210 = local_120;
        uStack_208 = uStack_118;
        local_200 = local_150;
        uStack_1f8 = uStack_148;
        local_130 = local_150;
        uStack_128 = uStack_148;
        local_110 = local_120;
        uStack_108 = uStack_118;
      }
    }
  }
  Mat::Mat(&local_2e98);
  Mat::operator=(in_stack_ffffffffffffbdf0,m);
  Mat::~Mat((Mat *)0x344826);
  Mat::Mat(&local_2ee0);
  local_2ee4 = (local_2ba8 - ((int)local_2ba8 >> 0x1f)) * 2 & 0xfffffffc;
  local_2ee8 = (local_2bac - ((int)local_2bac >> 0x1f)) * 2 & 0xfffffffc;
  uVar40 = local_2ee8;
  if ((int)local_2ee8 < 0) {
    uVar40 = local_2ee8 + 3;
  }
  local_2eec = (int)uVar40 >> 2;
  uVar40 = local_2ee4;
  if ((int)local_2ee4 < 0) {
    uVar40 = local_2ee4 + 3;
  }
  local_2ef0 = (int)uVar40 >> 2;
  local_2ef4 = local_2eec * local_2ef0;
  Mat::create(in_stack_ffffffffffffbe08,(int)((ulong)in_stack_ffffffffffffbe00 >> 0x20),
              (int)in_stack_ffffffffffffbe00,in_stack_ffffffffffffbdfc,
              (size_t)in_stack_ffffffffffffbdf0,(Allocator *)m);
  local_2ef8 = local_2bb0 >> 2;
  local_2efc = local_2ef8 << 2;
  for (local_2f00 = 0; local_2f00 < local_2ef8; local_2f00 = local_2f00 + 1) {
    local_2f04 = local_2f00 << 2;
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    for (local_314c = 0; local_314c < local_2ef4; local_314c = local_314c + 1) {
      local_3158 = Mat::row(&local_2f50,local_314c);
      local_3160 = Mat::row(&local_2f98,local_314c);
      local_3168 = Mat::row(&local_2fe0,local_314c);
      local_3170 = Mat::row(&local_3028,local_314c);
      local_3174 = 0;
      local_29a8 = &local_3174;
      local_2820 = 0;
      local_31a0 = 0;
      uStack_3198 = 0;
      uStack_3190 = 0;
      uStack_3188 = 0;
      local_2860 = 0;
      local_31c0 = 0;
      uStack_31b8 = 0;
      uStack_31b0 = 0;
      uStack_31a8 = 0;
      local_28a0 = 0;
      local_31e0 = 0;
      uStack_31d8 = 0;
      uStack_31d0 = 0;
      uStack_31c8 = 0;
      local_28e0 = 0;
      local_3200 = 0;
      uStack_31f8 = 0;
      uStack_31f0 = 0;
      uStack_31e8 = 0;
      local_2920 = 0;
      local_3220 = 0;
      uStack_3218 = 0;
      uStack_3210 = 0;
      uStack_3208 = 0;
      local_2960 = 0;
      local_3240 = 0;
      uStack_3238 = 0;
      uStack_3230 = 0;
      uStack_3228 = 0;
      local_29a0 = 0;
      local_3260 = 0;
      uStack_3258 = 0;
      uStack_3250 = 0;
      uStack_3248 = 0;
      local_29e0 = 0;
      local_3280 = 0;
      uStack_3278 = 0;
      uStack_3270 = 0;
      uStack_3268 = 0;
      uStack_29dc = local_29e0;
      uStack_29d8 = local_29e0;
      uStack_29d4 = local_29e0;
      uStack_29d0 = local_29e0;
      uStack_29cc = local_29e0;
      uStack_29c8 = local_29e0;
      uStack_29c4 = local_29e0;
      local_29ac = local_29e0;
      uStack_299c = local_29a0;
      uStack_2998 = local_29a0;
      uStack_2994 = local_29a0;
      uStack_2990 = local_29a0;
      uStack_298c = local_29a0;
      uStack_2988 = local_29a0;
      uStack_2984 = local_29a0;
      local_296c = local_29a0;
      local_2968 = local_29a8;
      uStack_295c = local_2960;
      uStack_2958 = local_2960;
      uStack_2954 = local_2960;
      uStack_2950 = local_2960;
      uStack_294c = local_2960;
      uStack_2948 = local_2960;
      uStack_2944 = local_2960;
      local_292c = local_2960;
      local_2928 = local_29a8;
      uStack_291c = local_2920;
      uStack_2918 = local_2920;
      uStack_2914 = local_2920;
      uStack_2910 = local_2920;
      uStack_290c = local_2920;
      uStack_2908 = local_2920;
      uStack_2904 = local_2920;
      local_28ec = local_2920;
      local_28e8 = local_29a8;
      uStack_28dc = local_28e0;
      uStack_28d8 = local_28e0;
      uStack_28d4 = local_28e0;
      uStack_28d0 = local_28e0;
      uStack_28cc = local_28e0;
      uStack_28c8 = local_28e0;
      uStack_28c4 = local_28e0;
      local_28ac = local_28e0;
      local_28a8 = local_29a8;
      uStack_289c = local_28a0;
      uStack_2898 = local_28a0;
      uStack_2894 = local_28a0;
      uStack_2890 = local_28a0;
      uStack_288c = local_28a0;
      uStack_2888 = local_28a0;
      uStack_2884 = local_28a0;
      local_286c = local_28a0;
      local_2868 = local_29a8;
      uStack_285c = local_2860;
      uStack_2858 = local_2860;
      uStack_2854 = local_2860;
      uStack_2850 = local_2860;
      uStack_284c = local_2860;
      uStack_2848 = local_2860;
      uStack_2844 = local_2860;
      local_282c = local_2860;
      local_2828 = local_29a8;
      uStack_281c = local_2820;
      uStack_2818 = local_2820;
      uStack_2814 = local_2820;
      uStack_2810 = local_2820;
      uStack_280c = local_2820;
      uStack_2808 = local_2820;
      uStack_2804 = local_2820;
      local_27ec = local_2820;
      local_27e8 = local_29a8;
      for (local_3284 = 0; local_3284 + 3 < local_2ba4; local_3284 = local_3284 + 4) {
        Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
        pfVar41 = Mat::row(&local_32d8,local_314c);
        Mat::~Mat((Mat *)0x344d6e);
        local_3290 = pfVar41;
        Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
        pfVar41 = Mat::row(&local_3328,local_314c);
        Mat::~Mat((Mat *)0x344dcf);
        local_32e0 = pfVar41;
        Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
        pfVar41 = Mat::row(&local_3378,local_314c);
        Mat::~Mat((Mat *)0x344e31);
        local_3330 = pfVar41;
        Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
        pfVar41 = Mat::row(&local_33c8,local_314c);
        Mat::~Mat((Mat *)0x344e8b);
        local_3380 = pfVar41;
        local_33d0 = Mat::row(&local_3070,local_3284);
        local_33d8 = Mat::row(&local_30b8,local_3284);
        local_33e0 = Mat::row(&local_3100,local_3284);
        local_33e8 = Mat::row(&local_3148,local_3284);
        local_29e8 = local_3290;
        local_1940 = *(undefined8 *)local_3290;
        uStack_1938 = *(undefined8 *)(local_3290 + 2);
        uStack_1930 = *(undefined8 *)(local_3290 + 4);
        uStack_1928 = *(undefined8 *)(local_3290 + 6);
        local_29f0 = local_3290 + 8;
        local_19a0 = *(undefined8 *)local_29f0;
        uStack_1998 = *(undefined8 *)(local_3290 + 10);
        uStack_1990 = *(undefined8 *)(local_3290 + 0xc);
        uStack_1988 = *(undefined8 *)(local_3290 + 0xe);
        local_29f8 = local_33d0;
        local_1720 = *(undefined8 *)local_33d0;
        uStack_1718 = *(undefined8 *)(local_33d0 + 2);
        uStack_1710 = *(undefined8 *)(local_33d0 + 4);
        uStack_1708 = *(undefined8 *)(local_33d0 + 6);
        local_2a00 = local_33d0 + 8;
        local_1780 = *(undefined8 *)local_2a00;
        uStack_1778 = *(undefined8 *)(local_33d0 + 10);
        uStack_1770 = *(undefined8 *)(local_33d0 + 0xc);
        uStack_1768 = *(undefined8 *)(local_33d0 + 0xe);
        local_2a08 = local_33d8;
        local_17e0 = *(undefined8 *)local_33d8;
        uStack_17d8 = *(undefined8 *)(local_33d8 + 2);
        uStack_17d0 = *(undefined8 *)(local_33d8 + 4);
        uStack_17c8 = *(undefined8 *)(local_33d8 + 6);
        local_2a10 = local_33d8 + 8;
        local_1840 = *(undefined8 *)local_2a10;
        uStack_1838 = *(undefined8 *)(local_33d8 + 10);
        uStack_1830 = *(undefined8 *)(local_33d8 + 0xc);
        uStack_1828 = *(undefined8 *)(local_33d8 + 0xe);
        local_2a18 = local_33e0;
        local_18a0 = *(undefined8 *)local_33e0;
        uStack_1898 = *(undefined8 *)(local_33e0 + 2);
        uStack_1890 = *(undefined8 *)(local_33e0 + 4);
        uStack_1888 = *(undefined8 *)(local_33e0 + 6);
        local_2a20 = local_33e0 + 8;
        local_1900 = *(undefined8 *)local_2a20;
        uStack_18f8 = *(undefined8 *)(local_33e0 + 10);
        uStack_18f0 = *(undefined8 *)(local_33e0 + 0xc);
        uStack_18e8 = *(undefined8 *)(local_33e0 + 0xe);
        local_1960 = *(undefined8 *)local_33e8;
        uStack_1958 = *(undefined8 *)(local_33e8 + 2);
        uStack_1950 = *(undefined8 *)(local_33e8 + 4);
        uStack_1948 = *(undefined8 *)(local_33e8 + 6);
        local_2a30 = local_33e8 + 8;
        local_19c0 = *(undefined8 *)local_2a30;
        uStack_19b8 = *(undefined8 *)(local_33e8 + 10);
        uStack_19b0 = *(undefined8 *)(local_33e8 + 0xc);
        uStack_19a8 = *(undefined8 *)(local_33e8 + 0xe);
        local_1740 = local_31a0;
        uStack_1738 = uStack_3198;
        uStack_1730 = uStack_3190;
        uStack_1728 = uStack_3188;
        local_1700._0_4_ = (float)local_1940;
        local_16c0 = (float)local_1700;
        local_1700._4_4_ = (float)((ulong)local_1940 >> 0x20);
        fStack_16bc = local_1700._4_4_;
        uStack_16f8._0_4_ = (float)uStack_1938;
        fStack_16b8 = (float)uStack_16f8;
        uStack_16f8._4_4_ = (float)((ulong)uStack_1938 >> 0x20);
        fStack_16b4 = uStack_16f8._4_4_;
        uStack_16f0._0_4_ = (float)uStack_1930;
        fStack_16b0 = (float)uStack_16f0;
        uStack_16f0._4_4_ = (float)((ulong)uStack_1930 >> 0x20);
        fStack_16ac = uStack_16f0._4_4_;
        uStack_16e8._0_4_ = (float)uStack_1928;
        fStack_16a8 = (float)uStack_16e8;
        uStack_16e8._4_4_ = (float)((ulong)uStack_1928 >> 0x20);
        fStack_16a4 = uStack_16e8._4_4_;
        local_16e0._0_4_ = (float)local_1720;
        local_16e0._4_4_ = (float)((ulong)local_1720 >> 0x20);
        uStack_16d8._0_4_ = (float)uStack_1718;
        uStack_16d8._4_4_ = (float)((ulong)uStack_1718 >> 0x20);
        uStack_16d0._0_4_ = (float)uStack_1710;
        uStack_16d0._4_4_ = (float)((ulong)uStack_1710 >> 0x20);
        uStack_16c8._0_4_ = (float)uStack_1708;
        local_cc0 = (float)local_1700 * (float)local_16e0;
        fStack_cbc = local_1700._4_4_ * local_16e0._4_4_;
        fStack_cb8 = (float)uStack_16f8 * (float)uStack_16d8;
        fStack_cb4 = uStack_16f8._4_4_ * uStack_16d8._4_4_;
        fStack_cb0 = (float)uStack_16f0 * (float)uStack_16d0;
        fStack_cac = uStack_16f0._4_4_ * uStack_16d0._4_4_;
        fStack_ca8 = (float)uStack_16e8 * (float)uStack_16c8;
        uVar6 = local_31a0;
        uVar7 = uStack_3198;
        uVar8 = uStack_3190;
        uVar9 = uStack_3188;
        local_ce0._0_4_ = (float)local_31a0;
        local_ce0._4_4_ = (float)((ulong)local_31a0 >> 0x20);
        uStack_cd8._0_4_ = (float)uStack_3198;
        uStack_cd8._4_4_ = (float)((ulong)uStack_3198 >> 0x20);
        uStack_cd0._0_4_ = (float)uStack_3190;
        uStack_cd0._4_4_ = (float)((ulong)uStack_3190 >> 0x20);
        uStack_cc8._0_4_ = (float)uStack_3188;
        uStack_cc8._4_4_ = (float)((ulong)uStack_3188 >> 0x20);
        local_1a40 = CONCAT44(fStack_cbc + local_ce0._4_4_,local_cc0 + (float)local_ce0);
        uStack_1a38 = CONCAT44(fStack_cb4 + uStack_cd8._4_4_,fStack_cb8 + (float)uStack_cd8);
        uStack_1a30 = CONCAT44(fStack_cac + uStack_cd0._4_4_,fStack_cb0 + (float)uStack_cd0);
        uStack_1a28 = CONCAT44(uStack_16e8._4_4_ + uStack_cc8._4_4_,fStack_ca8 + (float)uStack_cc8);
        local_17a0 = local_31c0;
        uStack_1798 = uStack_31b8;
        uStack_1790 = uStack_31b0;
        uStack_1788 = uStack_31a8;
        local_1760._0_4_ = (float)local_19a0;
        local_1680 = (float)local_1760;
        local_1760._4_4_ = (float)((ulong)local_19a0 >> 0x20);
        fStack_167c = local_1760._4_4_;
        uStack_1758._0_4_ = (float)uStack_1998;
        fStack_1678 = (float)uStack_1758;
        uStack_1758._4_4_ = (float)((ulong)uStack_1998 >> 0x20);
        fStack_1674 = uStack_1758._4_4_;
        uStack_1750._0_4_ = (float)uStack_1990;
        fStack_1670 = (float)uStack_1750;
        uStack_1750._4_4_ = (float)((ulong)uStack_1990 >> 0x20);
        fStack_166c = uStack_1750._4_4_;
        uStack_1748._0_4_ = (float)uStack_1988;
        fStack_1668 = (float)uStack_1748;
        uStack_1748._4_4_ = (float)((ulong)uStack_1988 >> 0x20);
        fStack_1664 = uStack_1748._4_4_;
        local_16a0._0_4_ = (float)local_1780;
        local_16a0._4_4_ = (float)((ulong)local_1780 >> 0x20);
        uStack_1698._0_4_ = (float)uStack_1778;
        uStack_1698._4_4_ = (float)((ulong)uStack_1778 >> 0x20);
        uStack_1690._0_4_ = (float)uStack_1770;
        uStack_1690._4_4_ = (float)((ulong)uStack_1770 >> 0x20);
        uStack_1688._0_4_ = (float)uStack_1768;
        local_c80 = (float)local_1760 * (float)local_16a0;
        fStack_c7c = local_1760._4_4_ * local_16a0._4_4_;
        fStack_c78 = (float)uStack_1758 * (float)uStack_1698;
        fStack_c74 = uStack_1758._4_4_ * uStack_1698._4_4_;
        fStack_c70 = (float)uStack_1750 * (float)uStack_1690;
        fStack_c6c = uStack_1750._4_4_ * uStack_1690._4_4_;
        fStack_c68 = (float)uStack_1748 * (float)uStack_1688;
        uVar10 = local_31c0;
        uVar11 = uStack_31b8;
        uVar12 = uStack_31b0;
        uVar13 = uStack_31a8;
        local_ca0._0_4_ = (float)local_31c0;
        local_ca0._4_4_ = (float)((ulong)local_31c0 >> 0x20);
        uStack_c98._0_4_ = (float)uStack_31b8;
        uStack_c98._4_4_ = (float)((ulong)uStack_31b8 >> 0x20);
        uStack_c90._0_4_ = (float)uStack_31b0;
        uStack_c90._4_4_ = (float)((ulong)uStack_31b0 >> 0x20);
        uStack_c88._0_4_ = (float)uStack_31a8;
        uStack_c88._4_4_ = (float)((ulong)uStack_31a8 >> 0x20);
        local_1aa0 = CONCAT44(fStack_c7c + local_ca0._4_4_,local_c80 + (float)local_ca0);
        uStack_1a98 = CONCAT44(fStack_c74 + uStack_c98._4_4_,fStack_c78 + (float)uStack_c98);
        uStack_1a90 = CONCAT44(fStack_c6c + uStack_c90._4_4_,fStack_c70 + (float)uStack_c90);
        uStack_1a88 = CONCAT44(uStack_1748._4_4_ + uStack_c88._4_4_,fStack_c68 + (float)uStack_c88);
        local_1800 = local_31e0;
        uStack_17f8 = uStack_31d8;
        uStack_17f0 = uStack_31d0;
        uStack_17e8 = uStack_31c8;
        local_1640 = (float)local_1700;
        fStack_163c = local_1700._4_4_;
        fStack_1638 = (float)uStack_16f8;
        fStack_1634 = uStack_16f8._4_4_;
        fStack_1630 = (float)uStack_16f0;
        fStack_162c = uStack_16f0._4_4_;
        fStack_1628 = (float)uStack_16e8;
        fStack_1624 = uStack_16e8._4_4_;
        local_1660._0_4_ = (float)local_17e0;
        local_1660._4_4_ = (float)((ulong)local_17e0 >> 0x20);
        uStack_1658._0_4_ = (float)uStack_17d8;
        uStack_1658._4_4_ = (float)((ulong)uStack_17d8 >> 0x20);
        uStack_1650._0_4_ = (float)uStack_17d0;
        uStack_1650._4_4_ = (float)((ulong)uStack_17d0 >> 0x20);
        uStack_1648._0_4_ = (float)uStack_17c8;
        local_c40 = (float)local_1700 * (float)local_1660;
        fStack_c3c = local_1700._4_4_ * local_1660._4_4_;
        fStack_c38 = (float)uStack_16f8 * (float)uStack_1658;
        fStack_c34 = uStack_16f8._4_4_ * uStack_1658._4_4_;
        fStack_c30 = (float)uStack_16f0 * (float)uStack_1650;
        fStack_c2c = uStack_16f0._4_4_ * uStack_1650._4_4_;
        fStack_c28 = (float)uStack_16e8 * (float)uStack_1648;
        uVar14 = local_31e0;
        uVar15 = uStack_31d8;
        uVar16 = uStack_31d0;
        uVar17 = uStack_31c8;
        local_c60._0_4_ = (float)local_31e0;
        local_c60._4_4_ = (float)((ulong)local_31e0 >> 0x20);
        uStack_c58._0_4_ = (float)uStack_31d8;
        uStack_c58._4_4_ = (float)((ulong)uStack_31d8 >> 0x20);
        uStack_c50._0_4_ = (float)uStack_31d0;
        uStack_c50._4_4_ = (float)((ulong)uStack_31d0 >> 0x20);
        uStack_c48._0_4_ = (float)uStack_31c8;
        uStack_c48._4_4_ = (float)((ulong)uStack_31c8 >> 0x20);
        local_1b00 = CONCAT44(fStack_c3c + local_c60._4_4_,local_c40 + (float)local_c60);
        uStack_1af8 = CONCAT44(fStack_c34 + uStack_c58._4_4_,fStack_c38 + (float)uStack_c58);
        uStack_1af0 = CONCAT44(fStack_c2c + uStack_c50._4_4_,fStack_c30 + (float)uStack_c50);
        uStack_1ae8 = CONCAT44(uStack_16e8._4_4_ + uStack_c48._4_4_,fStack_c28 + (float)uStack_c48);
        local_1860 = local_3200;
        uStack_1858 = uStack_31f8;
        uStack_1850 = uStack_31f0;
        uStack_1848 = uStack_31e8;
        local_1600 = (float)local_1760;
        fStack_15fc = local_1760._4_4_;
        fStack_15f8 = (float)uStack_1758;
        fStack_15f4 = uStack_1758._4_4_;
        fStack_15f0 = (float)uStack_1750;
        fStack_15ec = uStack_1750._4_4_;
        fStack_15e8 = (float)uStack_1748;
        fStack_15e4 = uStack_1748._4_4_;
        local_1620._0_4_ = (float)local_1840;
        local_1620._4_4_ = (float)((ulong)local_1840 >> 0x20);
        uStack_1618._0_4_ = (float)uStack_1838;
        uStack_1618._4_4_ = (float)((ulong)uStack_1838 >> 0x20);
        uStack_1610._0_4_ = (float)uStack_1830;
        uStack_1610._4_4_ = (float)((ulong)uStack_1830 >> 0x20);
        uStack_1608._0_4_ = (float)uStack_1828;
        local_c00 = (float)local_1760 * (float)local_1620;
        fStack_bfc = local_1760._4_4_ * local_1620._4_4_;
        fStack_bf8 = (float)uStack_1758 * (float)uStack_1618;
        fStack_bf4 = uStack_1758._4_4_ * uStack_1618._4_4_;
        fStack_bf0 = (float)uStack_1750 * (float)uStack_1610;
        fStack_bec = uStack_1750._4_4_ * uStack_1610._4_4_;
        fStack_be8 = (float)uStack_1748 * (float)uStack_1608;
        uVar18 = local_3200;
        uVar19 = uStack_31f8;
        uVar20 = uStack_31f0;
        uVar21 = uStack_31e8;
        local_c20._0_4_ = (float)local_3200;
        local_c20._4_4_ = (float)((ulong)local_3200 >> 0x20);
        uStack_c18._0_4_ = (float)uStack_31f8;
        uStack_c18._4_4_ = (float)((ulong)uStack_31f8 >> 0x20);
        uStack_c10._0_4_ = (float)uStack_31f0;
        uStack_c10._4_4_ = (float)((ulong)uStack_31f0 >> 0x20);
        uStack_c08._0_4_ = (float)uStack_31e8;
        uStack_c08._4_4_ = (float)((ulong)uStack_31e8 >> 0x20);
        local_1b60 = CONCAT44(fStack_bfc + local_c20._4_4_,local_c00 + (float)local_c20);
        uStack_1b58 = CONCAT44(fStack_bf4 + uStack_c18._4_4_,fStack_bf8 + (float)uStack_c18);
        uStack_1b50 = CONCAT44(fStack_bec + uStack_c10._4_4_,fStack_bf0 + (float)uStack_c10);
        uStack_1b48 = CONCAT44(uStack_1748._4_4_ + uStack_c08._4_4_,fStack_be8 + (float)uStack_c08);
        local_18c0 = local_3220;
        uStack_18b8 = uStack_3218;
        uStack_18b0 = uStack_3210;
        uStack_18a8 = uStack_3208;
        local_15c0 = (float)local_1700;
        fStack_15bc = local_1700._4_4_;
        fStack_15b8 = (float)uStack_16f8;
        fStack_15b4 = uStack_16f8._4_4_;
        fStack_15b0 = (float)uStack_16f0;
        fStack_15ac = uStack_16f0._4_4_;
        fStack_15a8 = (float)uStack_16e8;
        fStack_15a4 = uStack_16e8._4_4_;
        local_15e0._0_4_ = (float)local_18a0;
        local_15e0._4_4_ = (float)((ulong)local_18a0 >> 0x20);
        uStack_15d8._0_4_ = (float)uStack_1898;
        uStack_15d8._4_4_ = (float)((ulong)uStack_1898 >> 0x20);
        uStack_15d0._0_4_ = (float)uStack_1890;
        uStack_15d0._4_4_ = (float)((ulong)uStack_1890 >> 0x20);
        uStack_15c8._0_4_ = (float)uStack_1888;
        local_bc0 = (float)local_1700 * (float)local_15e0;
        fStack_bbc = local_1700._4_4_ * local_15e0._4_4_;
        fStack_bb8 = (float)uStack_16f8 * (float)uStack_15d8;
        fStack_bb4 = uStack_16f8._4_4_ * uStack_15d8._4_4_;
        fStack_bb0 = (float)uStack_16f0 * (float)uStack_15d0;
        fStack_bac = uStack_16f0._4_4_ * uStack_15d0._4_4_;
        fStack_ba8 = (float)uStack_16e8 * (float)uStack_15c8;
        uVar22 = local_3220;
        uVar23 = uStack_3218;
        uVar24 = uStack_3210;
        uVar25 = uStack_3208;
        local_be0._0_4_ = (float)local_3220;
        local_be0._4_4_ = (float)((ulong)local_3220 >> 0x20);
        uStack_bd8._0_4_ = (float)uStack_3218;
        uStack_bd8._4_4_ = (float)((ulong)uStack_3218 >> 0x20);
        uStack_bd0._0_4_ = (float)uStack_3210;
        uStack_bd0._4_4_ = (float)((ulong)uStack_3210 >> 0x20);
        uStack_bc8._0_4_ = (float)uStack_3208;
        uStack_bc8._4_4_ = (float)((ulong)uStack_3208 >> 0x20);
        local_1bc0 = CONCAT44(fStack_bbc + local_be0._4_4_,local_bc0 + (float)local_be0);
        uStack_1bb8 = CONCAT44(fStack_bb4 + uStack_bd8._4_4_,fStack_bb8 + (float)uStack_bd8);
        uStack_1bb0 = CONCAT44(fStack_bac + uStack_bd0._4_4_,fStack_bb0 + (float)uStack_bd0);
        uStack_1ba8 = CONCAT44(uStack_16e8._4_4_ + uStack_bc8._4_4_,fStack_ba8 + (float)uStack_bc8);
        local_1920 = local_3240;
        uStack_1918 = uStack_3238;
        uStack_1910 = uStack_3230;
        uStack_1908 = uStack_3228;
        local_1580 = (float)local_1760;
        fStack_157c = local_1760._4_4_;
        fStack_1578 = (float)uStack_1758;
        fStack_1574 = uStack_1758._4_4_;
        fStack_1570 = (float)uStack_1750;
        fStack_156c = uStack_1750._4_4_;
        fStack_1568 = (float)uStack_1748;
        fStack_1564 = uStack_1748._4_4_;
        local_15a0._0_4_ = (float)local_1900;
        local_15a0._4_4_ = (float)((ulong)local_1900 >> 0x20);
        uStack_1598._0_4_ = (float)uStack_18f8;
        uStack_1598._4_4_ = (float)((ulong)uStack_18f8 >> 0x20);
        uStack_1590._0_4_ = (float)uStack_18f0;
        uStack_1590._4_4_ = (float)((ulong)uStack_18f0 >> 0x20);
        uStack_1588._0_4_ = (float)uStack_18e8;
        local_b80 = (float)local_1760 * (float)local_15a0;
        fStack_b7c = local_1760._4_4_ * local_15a0._4_4_;
        fStack_b78 = (float)uStack_1758 * (float)uStack_1598;
        fStack_b74 = uStack_1758._4_4_ * uStack_1598._4_4_;
        fStack_b70 = (float)uStack_1750 * (float)uStack_1590;
        fStack_b6c = uStack_1750._4_4_ * uStack_1590._4_4_;
        fStack_b68 = (float)uStack_1748 * (float)uStack_1588;
        uVar26 = local_3240;
        uVar27 = uStack_3238;
        uVar28 = uStack_3230;
        uVar29 = uStack_3228;
        local_ba0._0_4_ = (float)local_3240;
        local_ba0._4_4_ = (float)((ulong)local_3240 >> 0x20);
        uStack_b98._0_4_ = (float)uStack_3238;
        uStack_b98._4_4_ = (float)((ulong)uStack_3238 >> 0x20);
        uStack_b90._0_4_ = (float)uStack_3230;
        uStack_b90._4_4_ = (float)((ulong)uStack_3230 >> 0x20);
        uStack_b88._0_4_ = (float)uStack_3228;
        uStack_b88._4_4_ = (float)((ulong)uStack_3228 >> 0x20);
        local_1c20 = CONCAT44(fStack_b7c + local_ba0._4_4_,local_b80 + (float)local_ba0);
        uStack_1c18 = CONCAT44(fStack_b74 + uStack_b98._4_4_,fStack_b78 + (float)uStack_b98);
        uStack_1c10 = CONCAT44(fStack_b6c + uStack_b90._4_4_,fStack_b70 + (float)uStack_b90);
        uStack_1c08 = CONCAT44(uStack_1748._4_4_ + uStack_b88._4_4_,fStack_b68 + (float)uStack_b88);
        local_1980 = local_3260;
        uStack_1978 = uStack_3258;
        uStack_1970 = uStack_3250;
        uStack_1968 = uStack_3248;
        local_1540 = (float)local_1700;
        fStack_153c = local_1700._4_4_;
        fStack_1538 = (float)uStack_16f8;
        fStack_1534 = uStack_16f8._4_4_;
        fStack_1530 = (float)uStack_16f0;
        fStack_152c = uStack_16f0._4_4_;
        fStack_1528 = (float)uStack_16e8;
        fStack_1524 = uStack_16e8._4_4_;
        local_1560._0_4_ = (float)local_1960;
        local_1560._4_4_ = (float)((ulong)local_1960 >> 0x20);
        uStack_1558._0_4_ = (float)uStack_1958;
        uStack_1558._4_4_ = (float)((ulong)uStack_1958 >> 0x20);
        uStack_1550._0_4_ = (float)uStack_1950;
        uStack_1550._4_4_ = (float)((ulong)uStack_1950 >> 0x20);
        uStack_1548._0_4_ = (float)uStack_1948;
        local_b40 = (float)local_1700 * (float)local_1560;
        fStack_b3c = local_1700._4_4_ * local_1560._4_4_;
        fStack_b38 = (float)uStack_16f8 * (float)uStack_1558;
        fStack_b34 = uStack_16f8._4_4_ * uStack_1558._4_4_;
        fStack_b30 = (float)uStack_16f0 * (float)uStack_1550;
        fStack_b2c = uStack_16f0._4_4_ * uStack_1550._4_4_;
        fStack_b28 = (float)uStack_16e8 * (float)uStack_1548;
        uVar30 = local_3260;
        uVar31 = uStack_3258;
        uVar32 = uStack_3250;
        uVar33 = uStack_3248;
        local_b60._0_4_ = (float)local_3260;
        local_b60._4_4_ = (float)((ulong)local_3260 >> 0x20);
        uStack_b58._0_4_ = (float)uStack_3258;
        uStack_b58._4_4_ = (float)((ulong)uStack_3258 >> 0x20);
        uStack_b50._0_4_ = (float)uStack_3250;
        uStack_b50._4_4_ = (float)((ulong)uStack_3250 >> 0x20);
        uStack_b48._0_4_ = (float)uStack_3248;
        uStack_b48._4_4_ = (float)((ulong)uStack_3248 >> 0x20);
        local_1c80 = CONCAT44(fStack_b3c + local_b60._4_4_,local_b40 + (float)local_b60);
        uStack_1c78 = CONCAT44(fStack_b34 + uStack_b58._4_4_,fStack_b38 + (float)uStack_b58);
        uStack_1c70 = CONCAT44(fStack_b2c + uStack_b50._4_4_,fStack_b30 + (float)uStack_b50);
        uStack_1c68 = CONCAT44(uStack_16e8._4_4_ + uStack_b48._4_4_,fStack_b28 + (float)uStack_b48);
        local_19e0 = local_3280;
        uStack_19d8 = uStack_3278;
        uStack_19d0 = uStack_3270;
        uStack_19c8 = uStack_3268;
        local_1500 = (float)local_1760;
        fStack_14fc = local_1760._4_4_;
        fStack_14f8 = (float)uStack_1758;
        fStack_14f4 = uStack_1758._4_4_;
        fStack_14f0 = (float)uStack_1750;
        fStack_14ec = uStack_1750._4_4_;
        fStack_14e8 = (float)uStack_1748;
        fStack_14e4 = uStack_1748._4_4_;
        local_1520._0_4_ = (float)local_19c0;
        local_1520._4_4_ = (float)((ulong)local_19c0 >> 0x20);
        uStack_1518._0_4_ = (float)uStack_19b8;
        uStack_1518._4_4_ = (float)((ulong)uStack_19b8 >> 0x20);
        uStack_1510._0_4_ = (float)uStack_19b0;
        uStack_1510._4_4_ = (float)((ulong)uStack_19b0 >> 0x20);
        uStack_1508._0_4_ = (float)uStack_19a8;
        local_b00 = (float)local_1760 * (float)local_1520;
        fStack_afc = local_1760._4_4_ * local_1520._4_4_;
        fStack_af8 = (float)uStack_1758 * (float)uStack_1518;
        fStack_af4 = uStack_1758._4_4_ * uStack_1518._4_4_;
        fStack_af0 = (float)uStack_1750 * (float)uStack_1510;
        fStack_aec = uStack_1750._4_4_ * uStack_1510._4_4_;
        fStack_ae8 = (float)uStack_1748 * (float)uStack_1508;
        uVar34 = local_3280;
        uVar35 = uStack_3278;
        uVar36 = uStack_3270;
        uVar37 = uStack_3268;
        local_b20._0_4_ = (float)local_3280;
        local_b20._4_4_ = (float)((ulong)local_3280 >> 0x20);
        uStack_b18._0_4_ = (float)uStack_3278;
        uStack_b18._4_4_ = (float)((ulong)uStack_3278 >> 0x20);
        uStack_b10._0_4_ = (float)uStack_3270;
        uStack_b10._4_4_ = (float)((ulong)uStack_3270 >> 0x20);
        uStack_b08._0_4_ = (float)uStack_3268;
        uStack_b08._4_4_ = (float)((ulong)uStack_3268 >> 0x20);
        local_1ce0 = CONCAT44(fStack_afc + local_b20._4_4_,local_b00 + (float)local_b20);
        uStack_1cd8 = CONCAT44(fStack_af4 + uStack_b18._4_4_,fStack_af8 + (float)uStack_b18);
        uStack_1cd0 = CONCAT44(fStack_aec + uStack_b10._4_4_,fStack_af0 + (float)uStack_b10);
        uStack_1cc8 = CONCAT44(uStack_1748._4_4_ + uStack_b08._4_4_,fStack_ae8 + (float)uStack_b08);
        local_2a38 = local_32e0;
        local_1c40 = *(undefined8 *)local_32e0;
        uStack_1c38 = *(undefined8 *)(local_32e0 + 2);
        uStack_1c30 = *(undefined8 *)(local_32e0 + 4);
        uStack_1c28 = *(undefined8 *)(local_32e0 + 6);
        local_2a40 = local_32e0 + 8;
        local_1ca0 = *(undefined8 *)local_2a40;
        uStack_1c98 = *(undefined8 *)(local_32e0 + 10);
        uStack_1c90 = *(undefined8 *)(local_32e0 + 0xc);
        uStack_1c88 = *(undefined8 *)(local_32e0 + 0xe);
        local_2a48 = local_33d0 + 0x10;
        local_1a20 = *(undefined8 *)local_2a48;
        uStack_1a18 = *(undefined8 *)(local_33d0 + 0x12);
        uStack_1a10 = *(undefined8 *)(local_33d0 + 0x14);
        uStack_1a08 = *(undefined8 *)(local_33d0 + 0x16);
        local_2a50 = local_33d0 + 0x18;
        local_1a80 = *(undefined8 *)local_2a50;
        uStack_1a78 = *(undefined8 *)(local_33d0 + 0x1a);
        uStack_1a70 = *(undefined8 *)(local_33d0 + 0x1c);
        uStack_1a68 = *(undefined8 *)(local_33d0 + 0x1e);
        local_2a58 = local_33d8 + 0x10;
        local_1ae0 = *(undefined8 *)local_2a58;
        uStack_1ad8 = *(undefined8 *)(local_33d8 + 0x12);
        uStack_1ad0 = *(undefined8 *)(local_33d8 + 0x14);
        uStack_1ac8 = *(undefined8 *)(local_33d8 + 0x16);
        local_2a60 = local_33d8 + 0x18;
        local_1b40 = *(undefined8 *)local_2a60;
        uStack_1b38 = *(undefined8 *)(local_33d8 + 0x1a);
        uStack_1b30 = *(undefined8 *)(local_33d8 + 0x1c);
        uStack_1b28 = *(undefined8 *)(local_33d8 + 0x1e);
        local_2a68 = local_33e0 + 0x10;
        local_1ba0 = *(undefined8 *)local_2a68;
        uStack_1b98 = *(undefined8 *)(local_33e0 + 0x12);
        uStack_1b90 = *(undefined8 *)(local_33e0 + 0x14);
        uStack_1b88 = *(undefined8 *)(local_33e0 + 0x16);
        local_2a70 = local_33e0 + 0x18;
        local_1c00 = *(undefined8 *)local_2a70;
        uStack_1bf8 = *(undefined8 *)(local_33e0 + 0x1a);
        uStack_1bf0 = *(undefined8 *)(local_33e0 + 0x1c);
        uStack_1be8 = *(undefined8 *)(local_33e0 + 0x1e);
        local_2a78 = local_33e8 + 0x10;
        local_1c60 = *(undefined8 *)local_2a78;
        uStack_1c58 = *(undefined8 *)(local_33e8 + 0x12);
        uStack_1c50 = *(undefined8 *)(local_33e8 + 0x14);
        uStack_1c48 = *(undefined8 *)(local_33e8 + 0x16);
        local_2a80 = local_33e8 + 0x18;
        local_1cc0 = *(undefined8 *)local_2a80;
        uStack_1cb8 = *(undefined8 *)(local_33e8 + 0x1a);
        uStack_1cb0 = *(undefined8 *)(local_33e8 + 0x1c);
        uStack_1ca8 = *(undefined8 *)(local_33e8 + 0x1e);
        local_1a00._0_4_ = (float)local_1c40;
        local_14c0 = (float)local_1a00;
        local_1a00._4_4_ = (float)((ulong)local_1c40 >> 0x20);
        fStack_14bc = local_1a00._4_4_;
        uStack_19f8._0_4_ = (float)uStack_1c38;
        fStack_14b8 = (float)uStack_19f8;
        uStack_19f8._4_4_ = (float)((ulong)uStack_1c38 >> 0x20);
        fStack_14b4 = uStack_19f8._4_4_;
        uStack_19f0._0_4_ = (float)uStack_1c30;
        fStack_14b0 = (float)uStack_19f0;
        uStack_19f0._4_4_ = (float)((ulong)uStack_1c30 >> 0x20);
        fStack_14ac = uStack_19f0._4_4_;
        uStack_19e8._0_4_ = (float)uStack_1c28;
        fStack_14a8 = (float)uStack_19e8;
        uStack_19e8._4_4_ = (float)((ulong)uStack_1c28 >> 0x20);
        fStack_14a4 = uStack_19e8._4_4_;
        local_14e0._0_4_ = (float)local_1a20;
        local_14e0._4_4_ = (float)((ulong)local_1a20 >> 0x20);
        uStack_14d8._0_4_ = (float)uStack_1a18;
        uStack_14d8._4_4_ = (float)((ulong)uStack_1a18 >> 0x20);
        uStack_14d0._0_4_ = (float)uStack_1a10;
        uStack_14d0._4_4_ = (float)((ulong)uStack_1a10 >> 0x20);
        uStack_14c8._0_4_ = (float)uStack_1a08;
        local_ac0 = (float)local_1a00 * (float)local_14e0;
        fStack_abc = local_1a00._4_4_ * local_14e0._4_4_;
        fStack_ab8 = (float)uStack_19f8 * (float)uStack_14d8;
        fStack_ab4 = uStack_19f8._4_4_ * uStack_14d8._4_4_;
        fStack_ab0 = (float)uStack_19f0 * (float)uStack_14d0;
        fStack_aac = uStack_19f0._4_4_ * uStack_14d0._4_4_;
        fStack_aa8 = (float)uStack_19e8 * (float)uStack_14c8;
        fVar42 = local_ac0 + local_cc0 + (float)local_ce0;
        fVar50 = fStack_abc + fStack_cbc + local_ce0._4_4_;
        fVar58 = fStack_ab8 + fStack_cb8 + (float)uStack_cd8;
        fVar66 = fStack_ab4 + fStack_cb4 + uStack_cd8._4_4_;
        fVar74 = fStack_ab0 + fStack_cb0 + (float)uStack_cd0;
        fVar82 = fStack_aac + fStack_cac + uStack_cd0._4_4_;
        fVar90 = fStack_aa8 + fStack_ca8 + (float)uStack_cc8;
        fVar98 = uStack_19e8._4_4_ + uStack_16e8._4_4_ + uStack_cc8._4_4_;
        local_1d40 = CONCAT44(fVar50,fVar42);
        uStack_1d38 = CONCAT44(fVar66,fVar58);
        uStack_1d30 = CONCAT44(fVar82,fVar74);
        uStack_1d28 = CONCAT44(fVar98,fVar90);
        local_1a60._0_4_ = (float)local_1ca0;
        local_1480 = (float)local_1a60;
        local_1a60._4_4_ = (float)((ulong)local_1ca0 >> 0x20);
        fStack_147c = local_1a60._4_4_;
        uStack_1a58._0_4_ = (float)uStack_1c98;
        fStack_1478 = (float)uStack_1a58;
        uStack_1a58._4_4_ = (float)((ulong)uStack_1c98 >> 0x20);
        fStack_1474 = uStack_1a58._4_4_;
        uStack_1a50._0_4_ = (float)uStack_1c90;
        fStack_1470 = (float)uStack_1a50;
        uStack_1a50._4_4_ = (float)((ulong)uStack_1c90 >> 0x20);
        fStack_146c = uStack_1a50._4_4_;
        uStack_1a48._0_4_ = (float)uStack_1c88;
        fStack_1468 = (float)uStack_1a48;
        uStack_1a48._4_4_ = (float)((ulong)uStack_1c88 >> 0x20);
        fStack_1464 = uStack_1a48._4_4_;
        local_14a0._0_4_ = (float)local_1a80;
        local_14a0._4_4_ = (float)((ulong)local_1a80 >> 0x20);
        uStack_1498._0_4_ = (float)uStack_1a78;
        uStack_1498._4_4_ = (float)((ulong)uStack_1a78 >> 0x20);
        uStack_1490._0_4_ = (float)uStack_1a70;
        uStack_1490._4_4_ = (float)((ulong)uStack_1a70 >> 0x20);
        uStack_1488._0_4_ = (float)uStack_1a68;
        local_a80 = (float)local_1a60 * (float)local_14a0;
        fStack_a7c = local_1a60._4_4_ * local_14a0._4_4_;
        fStack_a78 = (float)uStack_1a58 * (float)uStack_1498;
        fStack_a74 = uStack_1a58._4_4_ * uStack_1498._4_4_;
        fStack_a70 = (float)uStack_1a50 * (float)uStack_1490;
        fStack_a6c = uStack_1a50._4_4_ * uStack_1490._4_4_;
        fStack_a68 = (float)uStack_1a48 * (float)uStack_1488;
        fVar43 = local_a80 + local_c80 + (float)local_ca0;
        fVar51 = fStack_a7c + fStack_c7c + local_ca0._4_4_;
        fVar59 = fStack_a78 + fStack_c78 + (float)uStack_c98;
        fVar67 = fStack_a74 + fStack_c74 + uStack_c98._4_4_;
        fVar75 = fStack_a70 + fStack_c70 + (float)uStack_c90;
        fVar83 = fStack_a6c + fStack_c6c + uStack_c90._4_4_;
        fVar91 = fStack_a68 + fStack_c68 + (float)uStack_c88;
        fVar99 = uStack_1a48._4_4_ + uStack_1748._4_4_ + uStack_c88._4_4_;
        local_1da0 = CONCAT44(fVar51,fVar43);
        uStack_1d98 = CONCAT44(fVar67,fVar59);
        uStack_1d90 = CONCAT44(fVar83,fVar75);
        uStack_1d88 = CONCAT44(fVar99,fVar91);
        local_1440 = (float)local_1a00;
        fStack_143c = local_1a00._4_4_;
        fStack_1438 = (float)uStack_19f8;
        fStack_1434 = uStack_19f8._4_4_;
        fStack_1430 = (float)uStack_19f0;
        fStack_142c = uStack_19f0._4_4_;
        fStack_1428 = (float)uStack_19e8;
        fStack_1424 = uStack_19e8._4_4_;
        local_1460._0_4_ = (float)local_1ae0;
        local_1460._4_4_ = (float)((ulong)local_1ae0 >> 0x20);
        uStack_1458._0_4_ = (float)uStack_1ad8;
        uStack_1458._4_4_ = (float)((ulong)uStack_1ad8 >> 0x20);
        uStack_1450._0_4_ = (float)uStack_1ad0;
        uStack_1450._4_4_ = (float)((ulong)uStack_1ad0 >> 0x20);
        uStack_1448._0_4_ = (float)uStack_1ac8;
        local_a40 = (float)local_1a00 * (float)local_1460;
        fStack_a3c = local_1a00._4_4_ * local_1460._4_4_;
        fStack_a38 = (float)uStack_19f8 * (float)uStack_1458;
        fStack_a34 = uStack_19f8._4_4_ * uStack_1458._4_4_;
        fStack_a30 = (float)uStack_19f0 * (float)uStack_1450;
        fStack_a2c = uStack_19f0._4_4_ * uStack_1450._4_4_;
        fStack_a28 = (float)uStack_19e8 * (float)uStack_1448;
        fVar44 = local_a40 + local_c40 + (float)local_c60;
        fVar52 = fStack_a3c + fStack_c3c + local_c60._4_4_;
        fVar60 = fStack_a38 + fStack_c38 + (float)uStack_c58;
        fVar68 = fStack_a34 + fStack_c34 + uStack_c58._4_4_;
        fVar76 = fStack_a30 + fStack_c30 + (float)uStack_c50;
        fVar84 = fStack_a2c + fStack_c2c + uStack_c50._4_4_;
        fVar92 = fStack_a28 + fStack_c28 + (float)uStack_c48;
        fVar100 = uStack_19e8._4_4_ + uStack_16e8._4_4_ + uStack_c48._4_4_;
        local_1e00 = CONCAT44(fVar52,fVar44);
        uStack_1df8 = CONCAT44(fVar68,fVar60);
        uStack_1df0 = CONCAT44(fVar84,fVar76);
        uStack_1de8 = CONCAT44(fVar100,fVar92);
        local_1400 = (float)local_1a60;
        fStack_13fc = local_1a60._4_4_;
        fStack_13f8 = (float)uStack_1a58;
        fStack_13f4 = uStack_1a58._4_4_;
        fStack_13f0 = (float)uStack_1a50;
        fStack_13ec = uStack_1a50._4_4_;
        fStack_13e8 = (float)uStack_1a48;
        fStack_13e4 = uStack_1a48._4_4_;
        local_1420._0_4_ = (float)local_1b40;
        local_1420._4_4_ = (float)((ulong)local_1b40 >> 0x20);
        uStack_1418._0_4_ = (float)uStack_1b38;
        uStack_1418._4_4_ = (float)((ulong)uStack_1b38 >> 0x20);
        uStack_1410._0_4_ = (float)uStack_1b30;
        uStack_1410._4_4_ = (float)((ulong)uStack_1b30 >> 0x20);
        uStack_1408._0_4_ = (float)uStack_1b28;
        local_a00 = (float)local_1a60 * (float)local_1420;
        fStack_9fc = local_1a60._4_4_ * local_1420._4_4_;
        fStack_9f8 = (float)uStack_1a58 * (float)uStack_1418;
        fStack_9f4 = uStack_1a58._4_4_ * uStack_1418._4_4_;
        fStack_9f0 = (float)uStack_1a50 * (float)uStack_1410;
        fStack_9ec = uStack_1a50._4_4_ * uStack_1410._4_4_;
        fStack_9e8 = (float)uStack_1a48 * (float)uStack_1408;
        fVar45 = local_a00 + local_c00 + (float)local_c20;
        fVar53 = fStack_9fc + fStack_bfc + local_c20._4_4_;
        fVar61 = fStack_9f8 + fStack_bf8 + (float)uStack_c18;
        fVar69 = fStack_9f4 + fStack_bf4 + uStack_c18._4_4_;
        fVar77 = fStack_9f0 + fStack_bf0 + (float)uStack_c10;
        fVar85 = fStack_9ec + fStack_bec + uStack_c10._4_4_;
        fVar93 = fStack_9e8 + fStack_be8 + (float)uStack_c08;
        fVar101 = uStack_1a48._4_4_ + uStack_1748._4_4_ + uStack_c08._4_4_;
        local_1e60 = CONCAT44(fVar53,fVar45);
        uStack_1e58 = CONCAT44(fVar69,fVar61);
        uStack_1e50 = CONCAT44(fVar85,fVar77);
        uStack_1e48 = CONCAT44(fVar101,fVar93);
        local_13c0 = (float)local_1a00;
        fStack_13bc = local_1a00._4_4_;
        fStack_13b8 = (float)uStack_19f8;
        fStack_13b4 = uStack_19f8._4_4_;
        fStack_13b0 = (float)uStack_19f0;
        fStack_13ac = uStack_19f0._4_4_;
        fStack_13a8 = (float)uStack_19e8;
        fStack_13a4 = uStack_19e8._4_4_;
        local_13e0._0_4_ = (float)local_1ba0;
        local_13e0._4_4_ = (float)((ulong)local_1ba0 >> 0x20);
        uStack_13d8._0_4_ = (float)uStack_1b98;
        uStack_13d8._4_4_ = (float)((ulong)uStack_1b98 >> 0x20);
        uStack_13d0._0_4_ = (float)uStack_1b90;
        uStack_13d0._4_4_ = (float)((ulong)uStack_1b90 >> 0x20);
        uStack_13c8._0_4_ = (float)uStack_1b88;
        local_9c0 = (float)local_1a00 * (float)local_13e0;
        fStack_9bc = local_1a00._4_4_ * local_13e0._4_4_;
        fStack_9b8 = (float)uStack_19f8 * (float)uStack_13d8;
        fStack_9b4 = uStack_19f8._4_4_ * uStack_13d8._4_4_;
        fStack_9b0 = (float)uStack_19f0 * (float)uStack_13d0;
        fStack_9ac = uStack_19f0._4_4_ * uStack_13d0._4_4_;
        fStack_9a8 = (float)uStack_19e8 * (float)uStack_13c8;
        fVar46 = local_9c0 + local_bc0 + (float)local_be0;
        fVar54 = fStack_9bc + fStack_bbc + local_be0._4_4_;
        fVar62 = fStack_9b8 + fStack_bb8 + (float)uStack_bd8;
        fVar70 = fStack_9b4 + fStack_bb4 + uStack_bd8._4_4_;
        fVar78 = fStack_9b0 + fStack_bb0 + (float)uStack_bd0;
        fVar86 = fStack_9ac + fStack_bac + uStack_bd0._4_4_;
        fVar94 = fStack_9a8 + fStack_ba8 + (float)uStack_bc8;
        fVar102 = uStack_19e8._4_4_ + uStack_16e8._4_4_ + uStack_bc8._4_4_;
        local_1ec0 = CONCAT44(fVar54,fVar46);
        uStack_1eb8 = CONCAT44(fVar70,fVar62);
        uStack_1eb0 = CONCAT44(fVar86,fVar78);
        uStack_1ea8 = CONCAT44(fVar102,fVar94);
        local_1380 = (float)local_1a60;
        fStack_137c = local_1a60._4_4_;
        fStack_1378 = (float)uStack_1a58;
        fStack_1374 = uStack_1a58._4_4_;
        fStack_1370 = (float)uStack_1a50;
        fStack_136c = uStack_1a50._4_4_;
        fStack_1368 = (float)uStack_1a48;
        fStack_1364 = uStack_1a48._4_4_;
        local_13a0._0_4_ = (float)local_1c00;
        local_13a0._4_4_ = (float)((ulong)local_1c00 >> 0x20);
        uStack_1398._0_4_ = (float)uStack_1bf8;
        uStack_1398._4_4_ = (float)((ulong)uStack_1bf8 >> 0x20);
        uStack_1390._0_4_ = (float)uStack_1bf0;
        uStack_1390._4_4_ = (float)((ulong)uStack_1bf0 >> 0x20);
        uStack_1388._0_4_ = (float)uStack_1be8;
        local_980 = (float)local_1a60 * (float)local_13a0;
        fStack_97c = local_1a60._4_4_ * local_13a0._4_4_;
        fStack_978 = (float)uStack_1a58 * (float)uStack_1398;
        fStack_974 = uStack_1a58._4_4_ * uStack_1398._4_4_;
        fStack_970 = (float)uStack_1a50 * (float)uStack_1390;
        fStack_96c = uStack_1a50._4_4_ * uStack_1390._4_4_;
        fStack_968 = (float)uStack_1a48 * (float)uStack_1388;
        fVar47 = local_980 + local_b80 + (float)local_ba0;
        fVar55 = fStack_97c + fStack_b7c + local_ba0._4_4_;
        fVar63 = fStack_978 + fStack_b78 + (float)uStack_b98;
        fVar71 = fStack_974 + fStack_b74 + uStack_b98._4_4_;
        fVar79 = fStack_970 + fStack_b70 + (float)uStack_b90;
        fVar87 = fStack_96c + fStack_b6c + uStack_b90._4_4_;
        fVar95 = fStack_968 + fStack_b68 + (float)uStack_b88;
        fVar103 = uStack_1a48._4_4_ + uStack_1748._4_4_ + uStack_b88._4_4_;
        local_1f20 = CONCAT44(fVar55,fVar47);
        uStack_1f18 = CONCAT44(fVar71,fVar63);
        uStack_1f10 = CONCAT44(fVar87,fVar79);
        uStack_1f08 = CONCAT44(fVar103,fVar95);
        local_1340 = (float)local_1a00;
        fStack_133c = local_1a00._4_4_;
        fStack_1338 = (float)uStack_19f8;
        fStack_1334 = uStack_19f8._4_4_;
        fStack_1330 = (float)uStack_19f0;
        fStack_132c = uStack_19f0._4_4_;
        fStack_1328 = (float)uStack_19e8;
        fStack_1324 = uStack_19e8._4_4_;
        local_1360._0_4_ = (float)local_1c60;
        local_1360._4_4_ = (float)((ulong)local_1c60 >> 0x20);
        uStack_1358._0_4_ = (float)uStack_1c58;
        uStack_1358._4_4_ = (float)((ulong)uStack_1c58 >> 0x20);
        uStack_1350._0_4_ = (float)uStack_1c50;
        uStack_1350._4_4_ = (float)((ulong)uStack_1c50 >> 0x20);
        uStack_1348._0_4_ = (float)uStack_1c48;
        local_940 = (float)local_1a00 * (float)local_1360;
        fStack_93c = local_1a00._4_4_ * local_1360._4_4_;
        fStack_938 = (float)uStack_19f8 * (float)uStack_1358;
        fStack_934 = uStack_19f8._4_4_ * uStack_1358._4_4_;
        fStack_930 = (float)uStack_19f0 * (float)uStack_1350;
        fStack_92c = uStack_19f0._4_4_ * uStack_1350._4_4_;
        fStack_928 = (float)uStack_19e8 * (float)uStack_1348;
        fVar48 = local_940 + local_b40 + (float)local_b60;
        fVar56 = fStack_93c + fStack_b3c + local_b60._4_4_;
        fVar64 = fStack_938 + fStack_b38 + (float)uStack_b58;
        fVar72 = fStack_934 + fStack_b34 + uStack_b58._4_4_;
        fVar80 = fStack_930 + fStack_b30 + (float)uStack_b50;
        fVar88 = fStack_92c + fStack_b2c + uStack_b50._4_4_;
        fVar96 = fStack_928 + fStack_b28 + (float)uStack_b48;
        uStack_19e8._4_4_ = uStack_19e8._4_4_ + uStack_16e8._4_4_ + uStack_b48._4_4_;
        local_1f80 = CONCAT44(fVar56,fVar48);
        uStack_1f78 = CONCAT44(fVar72,fVar64);
        uStack_1f70 = CONCAT44(fVar88,fVar80);
        uStack_1f68 = CONCAT44(uStack_19e8._4_4_,fVar96);
        local_1300 = (float)local_1a60;
        fStack_12fc = local_1a60._4_4_;
        fStack_12f8 = (float)uStack_1a58;
        fStack_12f4 = uStack_1a58._4_4_;
        fStack_12f0 = (float)uStack_1a50;
        fStack_12ec = uStack_1a50._4_4_;
        fStack_12e8 = (float)uStack_1a48;
        fStack_12e4 = uStack_1a48._4_4_;
        local_1320._0_4_ = (float)local_1cc0;
        local_1320._4_4_ = (float)((ulong)local_1cc0 >> 0x20);
        uStack_1318._0_4_ = (float)uStack_1cb8;
        uStack_1318._4_4_ = (float)((ulong)uStack_1cb8 >> 0x20);
        uStack_1310._0_4_ = (float)uStack_1cb0;
        uStack_1310._4_4_ = (float)((ulong)uStack_1cb0 >> 0x20);
        uStack_1308._0_4_ = (float)uStack_1ca8;
        local_900 = (float)local_1a60 * (float)local_1320;
        fStack_8fc = local_1a60._4_4_ * local_1320._4_4_;
        fStack_8f8 = (float)uStack_1a58 * (float)uStack_1318;
        fStack_8f4 = uStack_1a58._4_4_ * uStack_1318._4_4_;
        fStack_8f0 = (float)uStack_1a50 * (float)uStack_1310;
        fStack_8ec = uStack_1a50._4_4_ * uStack_1310._4_4_;
        fStack_8e8 = (float)uStack_1a48 * (float)uStack_1308;
        fVar49 = local_900 + local_b00 + (float)local_b20;
        fVar57 = fStack_8fc + fStack_afc + local_b20._4_4_;
        fVar65 = fStack_8f8 + fStack_af8 + (float)uStack_b18;
        fVar73 = fStack_8f4 + fStack_af4 + uStack_b18._4_4_;
        fVar81 = fStack_8f0 + fStack_af0 + (float)uStack_b10;
        fVar89 = fStack_8ec + fStack_aec + uStack_b10._4_4_;
        fVar97 = fStack_8e8 + fStack_ae8 + (float)uStack_b08;
        uStack_1a48._4_4_ = uStack_1a48._4_4_ + uStack_1748._4_4_ + uStack_b08._4_4_;
        local_1fe0 = CONCAT44(fVar57,fVar49);
        uStack_1fd8 = CONCAT44(fVar73,fVar65);
        uStack_1fd0 = CONCAT44(fVar89,fVar81);
        uStack_1fc8 = CONCAT44(uStack_1a48._4_4_,fVar97);
        local_2a88 = local_3330;
        local_1f40 = *(undefined8 *)local_3330;
        uStack_1f38 = *(undefined8 *)(local_3330 + 2);
        uStack_1f30 = *(undefined8 *)(local_3330 + 4);
        uStack_1f28 = *(undefined8 *)(local_3330 + 6);
        local_2a90 = local_3330 + 8;
        local_1fa0 = *(undefined8 *)local_2a90;
        uStack_1f98 = *(undefined8 *)(local_3330 + 10);
        uStack_1f90 = *(undefined8 *)(local_3330 + 0xc);
        uStack_1f88 = *(undefined8 *)(local_3330 + 0xe);
        local_2a98 = local_33d0 + 0x20;
        local_1d20 = *(undefined8 *)local_2a98;
        uStack_1d18 = *(undefined8 *)(local_33d0 + 0x22);
        uStack_1d10 = *(undefined8 *)(local_33d0 + 0x24);
        uStack_1d08 = *(undefined8 *)(local_33d0 + 0x26);
        local_2aa0 = local_33d0 + 0x28;
        local_1d80 = *(undefined8 *)local_2aa0;
        uStack_1d78 = *(undefined8 *)(local_33d0 + 0x2a);
        uStack_1d70 = *(undefined8 *)(local_33d0 + 0x2c);
        uStack_1d68 = *(undefined8 *)(local_33d0 + 0x2e);
        local_2aa8 = local_33d8 + 0x20;
        local_1de0 = *(undefined8 *)local_2aa8;
        uStack_1dd8 = *(undefined8 *)(local_33d8 + 0x22);
        uStack_1dd0 = *(undefined8 *)(local_33d8 + 0x24);
        uStack_1dc8 = *(undefined8 *)(local_33d8 + 0x26);
        local_2ab0 = local_33d8 + 0x28;
        local_1e40 = *(undefined8 *)local_2ab0;
        uStack_1e38 = *(undefined8 *)(local_33d8 + 0x2a);
        uStack_1e30 = *(undefined8 *)(local_33d8 + 0x2c);
        uStack_1e28 = *(undefined8 *)(local_33d8 + 0x2e);
        local_2ab8 = local_33e0 + 0x20;
        local_1ea0 = *(undefined8 *)local_2ab8;
        uStack_1e98 = *(undefined8 *)(local_33e0 + 0x22);
        uStack_1e90 = *(undefined8 *)(local_33e0 + 0x24);
        uStack_1e88 = *(undefined8 *)(local_33e0 + 0x26);
        local_2ac0 = local_33e0 + 0x28;
        local_1f00 = *(undefined8 *)local_2ac0;
        uStack_1ef8 = *(undefined8 *)(local_33e0 + 0x2a);
        uStack_1ef0 = *(undefined8 *)(local_33e0 + 0x2c);
        uStack_1ee8 = *(undefined8 *)(local_33e0 + 0x2e);
        local_2ac8 = local_33e8 + 0x20;
        local_1f60 = *(undefined8 *)local_2ac8;
        uStack_1f58 = *(undefined8 *)(local_33e8 + 0x22);
        uStack_1f50 = *(undefined8 *)(local_33e8 + 0x24);
        uStack_1f48 = *(undefined8 *)(local_33e8 + 0x26);
        local_2ad0 = local_33e8 + 0x28;
        local_1fc0 = *(undefined8 *)local_2ad0;
        uStack_1fb8 = *(undefined8 *)(local_33e8 + 0x2a);
        uStack_1fb0 = *(undefined8 *)(local_33e8 + 0x2c);
        uStack_1fa8 = *(undefined8 *)(local_33e8 + 0x2e);
        local_1d00._0_4_ = (float)local_1f40;
        local_12c0 = (float)local_1d00;
        local_1d00._4_4_ = (float)((ulong)local_1f40 >> 0x20);
        fStack_12bc = local_1d00._4_4_;
        uStack_1cf8._0_4_ = (float)uStack_1f38;
        fStack_12b8 = (float)uStack_1cf8;
        uStack_1cf8._4_4_ = (float)((ulong)uStack_1f38 >> 0x20);
        fStack_12b4 = uStack_1cf8._4_4_;
        uStack_1cf0._0_4_ = (float)uStack_1f30;
        fStack_12b0 = (float)uStack_1cf0;
        uStack_1cf0._4_4_ = (float)((ulong)uStack_1f30 >> 0x20);
        fStack_12ac = uStack_1cf0._4_4_;
        uStack_1ce8._0_4_ = (float)uStack_1f28;
        fStack_12a8 = (float)uStack_1ce8;
        uStack_1ce8._4_4_ = (float)((ulong)uStack_1f28 >> 0x20);
        fStack_12a4 = uStack_1ce8._4_4_;
        local_12e0._0_4_ = (float)local_1d20;
        local_12e0._4_4_ = (float)((ulong)local_1d20 >> 0x20);
        uStack_12d8._0_4_ = (float)uStack_1d18;
        uStack_12d8._4_4_ = (float)((ulong)uStack_1d18 >> 0x20);
        uStack_12d0._0_4_ = (float)uStack_1d10;
        uStack_12d0._4_4_ = (float)((ulong)uStack_1d10 >> 0x20);
        uStack_12c8._0_4_ = (float)uStack_1d08;
        local_8c0 = (float)local_1d00 * (float)local_12e0;
        fStack_8bc = local_1d00._4_4_ * local_12e0._4_4_;
        fStack_8b8 = (float)uStack_1cf8 * (float)uStack_12d8;
        fStack_8b4 = uStack_1cf8._4_4_ * uStack_12d8._4_4_;
        fStack_8b0 = (float)uStack_1cf0 * (float)uStack_12d0;
        fStack_8ac = uStack_1cf0._4_4_ * uStack_12d0._4_4_;
        fStack_8a8 = (float)uStack_1ce8 * (float)uStack_12c8;
        fVar42 = local_8c0 + fVar42;
        fVar50 = fStack_8bc + fVar50;
        fVar58 = fStack_8b8 + fVar58;
        fVar66 = fStack_8b4 + fVar66;
        fVar74 = fStack_8b0 + fVar74;
        fVar82 = fStack_8ac + fVar82;
        fVar90 = fStack_8a8 + fVar90;
        fVar98 = uStack_1ce8._4_4_ + fVar98;
        local_2040 = CONCAT44(fVar50,fVar42);
        uStack_2038 = CONCAT44(fVar66,fVar58);
        uStack_2030 = CONCAT44(fVar82,fVar74);
        uStack_2028 = CONCAT44(fVar98,fVar90);
        local_1d60._0_4_ = (float)local_1fa0;
        local_1280 = (float)local_1d60;
        local_1d60._4_4_ = (float)((ulong)local_1fa0 >> 0x20);
        fStack_127c = local_1d60._4_4_;
        uStack_1d58._0_4_ = (float)uStack_1f98;
        fStack_1278 = (float)uStack_1d58;
        uStack_1d58._4_4_ = (float)((ulong)uStack_1f98 >> 0x20);
        fStack_1274 = uStack_1d58._4_4_;
        uStack_1d50._0_4_ = (float)uStack_1f90;
        fStack_1270 = (float)uStack_1d50;
        uStack_1d50._4_4_ = (float)((ulong)uStack_1f90 >> 0x20);
        fStack_126c = uStack_1d50._4_4_;
        uStack_1d48._0_4_ = (float)uStack_1f88;
        fStack_1268 = (float)uStack_1d48;
        uStack_1d48._4_4_ = (float)((ulong)uStack_1f88 >> 0x20);
        fStack_1264 = uStack_1d48._4_4_;
        local_12a0._0_4_ = (float)local_1d80;
        local_12a0._4_4_ = (float)((ulong)local_1d80 >> 0x20);
        uStack_1298._0_4_ = (float)uStack_1d78;
        uStack_1298._4_4_ = (float)((ulong)uStack_1d78 >> 0x20);
        uStack_1290._0_4_ = (float)uStack_1d70;
        uStack_1290._4_4_ = (float)((ulong)uStack_1d70 >> 0x20);
        uStack_1288._0_4_ = (float)uStack_1d68;
        local_880 = (float)local_1d60 * (float)local_12a0;
        fStack_87c = local_1d60._4_4_ * local_12a0._4_4_;
        fStack_878 = (float)uStack_1d58 * (float)uStack_1298;
        fStack_874 = uStack_1d58._4_4_ * uStack_1298._4_4_;
        fStack_870 = (float)uStack_1d50 * (float)uStack_1290;
        fStack_86c = uStack_1d50._4_4_ * uStack_1290._4_4_;
        fStack_868 = (float)uStack_1d48 * (float)uStack_1288;
        fVar43 = local_880 + fVar43;
        fVar51 = fStack_87c + fVar51;
        fVar59 = fStack_878 + fVar59;
        fVar67 = fStack_874 + fVar67;
        fVar75 = fStack_870 + fVar75;
        fVar83 = fStack_86c + fVar83;
        fVar91 = fStack_868 + fVar91;
        fVar99 = uStack_1d48._4_4_ + fVar99;
        local_20a0 = CONCAT44(fVar51,fVar43);
        uStack_2098 = CONCAT44(fVar67,fVar59);
        uStack_2090 = CONCAT44(fVar83,fVar75);
        uStack_2088 = CONCAT44(fVar99,fVar91);
        local_1240 = (float)local_1d00;
        fStack_123c = local_1d00._4_4_;
        fStack_1238 = (float)uStack_1cf8;
        fStack_1234 = uStack_1cf8._4_4_;
        fStack_1230 = (float)uStack_1cf0;
        fStack_122c = uStack_1cf0._4_4_;
        fStack_1228 = (float)uStack_1ce8;
        fStack_1224 = uStack_1ce8._4_4_;
        local_1260._0_4_ = (float)local_1de0;
        local_1260._4_4_ = (float)((ulong)local_1de0 >> 0x20);
        uStack_1258._0_4_ = (float)uStack_1dd8;
        uStack_1258._4_4_ = (float)((ulong)uStack_1dd8 >> 0x20);
        uStack_1250._0_4_ = (float)uStack_1dd0;
        uStack_1250._4_4_ = (float)((ulong)uStack_1dd0 >> 0x20);
        uStack_1248._0_4_ = (float)uStack_1dc8;
        local_840 = (float)local_1d00 * (float)local_1260;
        fStack_83c = local_1d00._4_4_ * local_1260._4_4_;
        fStack_838 = (float)uStack_1cf8 * (float)uStack_1258;
        fStack_834 = uStack_1cf8._4_4_ * uStack_1258._4_4_;
        fStack_830 = (float)uStack_1cf0 * (float)uStack_1250;
        fStack_82c = uStack_1cf0._4_4_ * uStack_1250._4_4_;
        fStack_828 = (float)uStack_1ce8 * (float)uStack_1248;
        fVar44 = local_840 + fVar44;
        fVar52 = fStack_83c + fVar52;
        fVar60 = fStack_838 + fVar60;
        fVar68 = fStack_834 + fVar68;
        fVar76 = fStack_830 + fVar76;
        fVar84 = fStack_82c + fVar84;
        fVar92 = fStack_828 + fVar92;
        fVar100 = uStack_1ce8._4_4_ + fVar100;
        local_2100 = CONCAT44(fVar52,fVar44);
        uStack_20f8 = CONCAT44(fVar68,fVar60);
        uStack_20f0 = CONCAT44(fVar84,fVar76);
        uStack_20e8 = CONCAT44(fVar100,fVar92);
        local_1200 = (float)local_1d60;
        fStack_11fc = local_1d60._4_4_;
        fStack_11f8 = (float)uStack_1d58;
        fStack_11f4 = uStack_1d58._4_4_;
        fStack_11f0 = (float)uStack_1d50;
        fStack_11ec = uStack_1d50._4_4_;
        fStack_11e8 = (float)uStack_1d48;
        fStack_11e4 = uStack_1d48._4_4_;
        local_1220._0_4_ = (float)local_1e40;
        local_1220._4_4_ = (float)((ulong)local_1e40 >> 0x20);
        uStack_1218._0_4_ = (float)uStack_1e38;
        uStack_1218._4_4_ = (float)((ulong)uStack_1e38 >> 0x20);
        uStack_1210._0_4_ = (float)uStack_1e30;
        uStack_1210._4_4_ = (float)((ulong)uStack_1e30 >> 0x20);
        uStack_1208._0_4_ = (float)uStack_1e28;
        local_800 = (float)local_1d60 * (float)local_1220;
        fStack_7fc = local_1d60._4_4_ * local_1220._4_4_;
        fStack_7f8 = (float)uStack_1d58 * (float)uStack_1218;
        fStack_7f4 = uStack_1d58._4_4_ * uStack_1218._4_4_;
        fStack_7f0 = (float)uStack_1d50 * (float)uStack_1210;
        fStack_7ec = uStack_1d50._4_4_ * uStack_1210._4_4_;
        fStack_7e8 = (float)uStack_1d48 * (float)uStack_1208;
        fVar45 = local_800 + fVar45;
        fVar53 = fStack_7fc + fVar53;
        fVar61 = fStack_7f8 + fVar61;
        fVar69 = fStack_7f4 + fVar69;
        fVar77 = fStack_7f0 + fVar77;
        fVar85 = fStack_7ec + fVar85;
        fVar93 = fStack_7e8 + fVar93;
        fVar101 = uStack_1d48._4_4_ + fVar101;
        local_2160 = CONCAT44(fVar53,fVar45);
        uStack_2158 = CONCAT44(fVar69,fVar61);
        uStack_2150 = CONCAT44(fVar85,fVar77);
        uStack_2148 = CONCAT44(fVar101,fVar93);
        local_11c0 = (float)local_1d00;
        fStack_11bc = local_1d00._4_4_;
        fStack_11b8 = (float)uStack_1cf8;
        fStack_11b4 = uStack_1cf8._4_4_;
        fStack_11b0 = (float)uStack_1cf0;
        fStack_11ac = uStack_1cf0._4_4_;
        fStack_11a8 = (float)uStack_1ce8;
        fStack_11a4 = uStack_1ce8._4_4_;
        local_11e0._0_4_ = (float)local_1ea0;
        local_11e0._4_4_ = (float)((ulong)local_1ea0 >> 0x20);
        uStack_11d8._0_4_ = (float)uStack_1e98;
        uStack_11d8._4_4_ = (float)((ulong)uStack_1e98 >> 0x20);
        uStack_11d0._0_4_ = (float)uStack_1e90;
        uStack_11d0._4_4_ = (float)((ulong)uStack_1e90 >> 0x20);
        uStack_11c8._0_4_ = (float)uStack_1e88;
        local_7c0 = (float)local_1d00 * (float)local_11e0;
        fStack_7bc = local_1d00._4_4_ * local_11e0._4_4_;
        fStack_7b8 = (float)uStack_1cf8 * (float)uStack_11d8;
        fStack_7b4 = uStack_1cf8._4_4_ * uStack_11d8._4_4_;
        fStack_7b0 = (float)uStack_1cf0 * (float)uStack_11d0;
        fStack_7ac = uStack_1cf0._4_4_ * uStack_11d0._4_4_;
        fStack_7a8 = (float)uStack_1ce8 * (float)uStack_11c8;
        fVar46 = local_7c0 + fVar46;
        fVar54 = fStack_7bc + fVar54;
        fVar62 = fStack_7b8 + fVar62;
        fVar70 = fStack_7b4 + fVar70;
        fVar78 = fStack_7b0 + fVar78;
        fVar86 = fStack_7ac + fVar86;
        fVar94 = fStack_7a8 + fVar94;
        fVar102 = uStack_1ce8._4_4_ + fVar102;
        local_21c0 = CONCAT44(fVar54,fVar46);
        uStack_21b8 = CONCAT44(fVar70,fVar62);
        uStack_21b0 = CONCAT44(fVar86,fVar78);
        uStack_21a8 = CONCAT44(fVar102,fVar94);
        local_1180 = (float)local_1d60;
        fStack_117c = local_1d60._4_4_;
        fStack_1178 = (float)uStack_1d58;
        fStack_1174 = uStack_1d58._4_4_;
        fStack_1170 = (float)uStack_1d50;
        fStack_116c = uStack_1d50._4_4_;
        fStack_1168 = (float)uStack_1d48;
        fStack_1164 = uStack_1d48._4_4_;
        local_11a0._0_4_ = (float)local_1f00;
        local_11a0._4_4_ = (float)((ulong)local_1f00 >> 0x20);
        uStack_1198._0_4_ = (float)uStack_1ef8;
        uStack_1198._4_4_ = (float)((ulong)uStack_1ef8 >> 0x20);
        uStack_1190._0_4_ = (float)uStack_1ef0;
        uStack_1190._4_4_ = (float)((ulong)uStack_1ef0 >> 0x20);
        uStack_1188._0_4_ = (float)uStack_1ee8;
        local_780 = (float)local_1d60 * (float)local_11a0;
        fStack_77c = local_1d60._4_4_ * local_11a0._4_4_;
        fStack_778 = (float)uStack_1d58 * (float)uStack_1198;
        fStack_774 = uStack_1d58._4_4_ * uStack_1198._4_4_;
        fStack_770 = (float)uStack_1d50 * (float)uStack_1190;
        fStack_76c = uStack_1d50._4_4_ * uStack_1190._4_4_;
        fStack_768 = (float)uStack_1d48 * (float)uStack_1188;
        fVar47 = local_780 + fVar47;
        fVar55 = fStack_77c + fVar55;
        fVar63 = fStack_778 + fVar63;
        fVar71 = fStack_774 + fVar71;
        fVar79 = fStack_770 + fVar79;
        fVar87 = fStack_76c + fVar87;
        fVar95 = fStack_768 + fVar95;
        fVar103 = uStack_1d48._4_4_ + fVar103;
        local_2220 = CONCAT44(fVar55,fVar47);
        uStack_2218 = CONCAT44(fVar71,fVar63);
        uStack_2210 = CONCAT44(fVar87,fVar79);
        uStack_2208 = CONCAT44(fVar103,fVar95);
        local_1140 = (float)local_1d00;
        fStack_113c = local_1d00._4_4_;
        fStack_1138 = (float)uStack_1cf8;
        fStack_1134 = uStack_1cf8._4_4_;
        fStack_1130 = (float)uStack_1cf0;
        fStack_112c = uStack_1cf0._4_4_;
        fStack_1128 = (float)uStack_1ce8;
        fStack_1124 = uStack_1ce8._4_4_;
        local_1160._0_4_ = (float)local_1f60;
        local_1160._4_4_ = (float)((ulong)local_1f60 >> 0x20);
        uStack_1158._0_4_ = (float)uStack_1f58;
        uStack_1158._4_4_ = (float)((ulong)uStack_1f58 >> 0x20);
        uStack_1150._0_4_ = (float)uStack_1f50;
        uStack_1150._4_4_ = (float)((ulong)uStack_1f50 >> 0x20);
        uStack_1148._0_4_ = (float)uStack_1f48;
        local_740 = (float)local_1d00 * (float)local_1160;
        fStack_73c = local_1d00._4_4_ * local_1160._4_4_;
        fStack_738 = (float)uStack_1cf8 * (float)uStack_1158;
        fStack_734 = uStack_1cf8._4_4_ * uStack_1158._4_4_;
        fStack_730 = (float)uStack_1cf0 * (float)uStack_1150;
        fStack_72c = uStack_1cf0._4_4_ * uStack_1150._4_4_;
        fStack_728 = (float)uStack_1ce8 * (float)uStack_1148;
        fVar48 = local_740 + fVar48;
        fVar56 = fStack_73c + fVar56;
        fVar64 = fStack_738 + fVar64;
        fVar72 = fStack_734 + fVar72;
        fVar80 = fStack_730 + fVar80;
        fVar88 = fStack_72c + fVar88;
        fVar96 = fStack_728 + fVar96;
        uStack_1ce8._4_4_ = uStack_1ce8._4_4_ + uStack_19e8._4_4_;
        local_2280 = CONCAT44(fVar56,fVar48);
        uStack_2278 = CONCAT44(fVar72,fVar64);
        uStack_2270 = CONCAT44(fVar88,fVar80);
        uStack_2268 = CONCAT44(uStack_1ce8._4_4_,fVar96);
        local_1100 = (float)local_1d60;
        fStack_10fc = local_1d60._4_4_;
        fStack_10f8 = (float)uStack_1d58;
        fStack_10f4 = uStack_1d58._4_4_;
        fStack_10f0 = (float)uStack_1d50;
        fStack_10ec = uStack_1d50._4_4_;
        fStack_10e8 = (float)uStack_1d48;
        fStack_10e4 = uStack_1d48._4_4_;
        local_1120._0_4_ = (float)local_1fc0;
        local_1120._4_4_ = (float)((ulong)local_1fc0 >> 0x20);
        uStack_1118._0_4_ = (float)uStack_1fb8;
        uStack_1118._4_4_ = (float)((ulong)uStack_1fb8 >> 0x20);
        uStack_1110._0_4_ = (float)uStack_1fb0;
        uStack_1110._4_4_ = (float)((ulong)uStack_1fb0 >> 0x20);
        uStack_1108._0_4_ = (float)uStack_1fa8;
        local_700 = (float)local_1d60 * (float)local_1120;
        fStack_6fc = local_1d60._4_4_ * local_1120._4_4_;
        fStack_6f8 = (float)uStack_1d58 * (float)uStack_1118;
        fStack_6f4 = uStack_1d58._4_4_ * uStack_1118._4_4_;
        fStack_6f0 = (float)uStack_1d50 * (float)uStack_1110;
        fStack_6ec = uStack_1d50._4_4_ * uStack_1110._4_4_;
        fStack_6e8 = (float)uStack_1d48 * (float)uStack_1108;
        fVar49 = local_700 + fVar49;
        fVar57 = fStack_6fc + fVar57;
        fVar65 = fStack_6f8 + fVar65;
        fVar73 = fStack_6f4 + fVar73;
        fVar81 = fStack_6f0 + fVar81;
        fVar89 = fStack_6ec + fVar89;
        fVar97 = fStack_6e8 + fVar97;
        uStack_1d48._4_4_ = uStack_1d48._4_4_ + uStack_1a48._4_4_;
        local_22e0 = CONCAT44(fVar57,fVar49);
        uStack_22d8 = CONCAT44(fVar73,fVar65);
        uStack_22d0 = CONCAT44(fVar89,fVar81);
        uStack_22c8 = CONCAT44(uStack_1d48._4_4_,fVar97);
        local_2ad8 = local_3380;
        local_3420 = *(undefined8 *)local_3380;
        uStack_3418 = *(undefined8 *)(local_3380 + 2);
        uStack_3410 = *(undefined8 *)(local_3380 + 4);
        uStack_3408 = *(undefined8 *)(local_3380 + 6);
        local_2ae0 = local_3380 + 8;
        local_3440 = *(undefined8 *)local_2ae0;
        uStack_3438 = *(undefined8 *)(local_3380 + 10);
        uStack_3430 = *(undefined8 *)(local_3380 + 0xc);
        uStack_3428 = *(undefined8 *)(local_3380 + 0xe);
        local_2ae8 = local_33d0 + 0x30;
        local_3460 = *(undefined8 *)local_2ae8;
        uStack_3458 = *(undefined8 *)(local_33d0 + 0x32);
        uStack_3450 = *(undefined8 *)(local_33d0 + 0x34);
        uStack_3448 = *(undefined8 *)(local_33d0 + 0x36);
        local_2af0 = local_33d0 + 0x38;
        local_3480 = *(undefined8 *)local_2af0;
        uStack_3478 = *(undefined8 *)(local_33d0 + 0x3a);
        uStack_3470 = *(undefined8 *)(local_33d0 + 0x3c);
        uStack_3468 = *(undefined8 *)(local_33d0 + 0x3e);
        local_2af8 = local_33d8 + 0x30;
        local_34a0 = *(undefined8 *)local_2af8;
        uStack_3498 = *(undefined8 *)(local_33d8 + 0x32);
        uStack_3490 = *(undefined8 *)(local_33d8 + 0x34);
        uStack_3488 = *(undefined8 *)(local_33d8 + 0x36);
        local_2b00 = local_33d8 + 0x38;
        local_34c0 = *(undefined8 *)local_2b00;
        uStack_34b8 = *(undefined8 *)(local_33d8 + 0x3a);
        uStack_34b0 = *(undefined8 *)(local_33d8 + 0x3c);
        uStack_34a8 = *(undefined8 *)(local_33d8 + 0x3e);
        local_2b08 = local_33e0 + 0x30;
        local_34e0 = *(undefined8 *)local_2b08;
        uStack_34d8 = *(undefined8 *)(local_33e0 + 0x32);
        uStack_34d0 = *(undefined8 *)(local_33e0 + 0x34);
        uStack_34c8 = *(undefined8 *)(local_33e0 + 0x36);
        local_2b10 = local_33e0 + 0x38;
        local_3500 = *(undefined8 *)local_2b10;
        uStack_34f8 = *(undefined8 *)(local_33e0 + 0x3a);
        uStack_34f0 = *(undefined8 *)(local_33e0 + 0x3c);
        uStack_34e8 = *(undefined8 *)(local_33e0 + 0x3e);
        local_2b18 = local_33e8 + 0x30;
        local_3520 = *(undefined8 *)local_2b18;
        uStack_3518 = *(undefined8 *)(local_33e8 + 0x32);
        uStack_3510 = *(undefined8 *)(local_33e8 + 0x34);
        uStack_3508 = *(undefined8 *)(local_33e8 + 0x36);
        local_2b20 = local_33e8 + 0x38;
        local_3540 = *(undefined8 *)local_2b20;
        uStack_3538 = *(undefined8 *)(local_33e8 + 0x3a);
        uStack_3530 = *(undefined8 *)(local_33e8 + 0x3c);
        uStack_3528 = *(undefined8 *)(local_33e8 + 0x3e);
        local_2000._0_4_ = (float)local_3420;
        local_10c0 = (float)local_2000;
        local_2000._4_4_ = (float)((ulong)local_3420 >> 0x20);
        fStack_10bc = local_2000._4_4_;
        uStack_1ff8._0_4_ = (float)uStack_3418;
        fStack_10b8 = (float)uStack_1ff8;
        uStack_1ff8._4_4_ = (float)((ulong)uStack_3418 >> 0x20);
        fStack_10b4 = uStack_1ff8._4_4_;
        uStack_1ff0._0_4_ = (float)uStack_3410;
        fStack_10b0 = (float)uStack_1ff0;
        uStack_1ff0._4_4_ = (float)((ulong)uStack_3410 >> 0x20);
        fStack_10ac = uStack_1ff0._4_4_;
        uStack_1fe8._0_4_ = (float)uStack_3408;
        fStack_10a8 = (float)uStack_1fe8;
        uStack_1fe8._4_4_ = (float)((ulong)uStack_3408 >> 0x20);
        fStack_10a4 = uStack_1fe8._4_4_;
        local_10e0._0_4_ = (float)local_3460;
        local_10e0._4_4_ = (float)((ulong)local_3460 >> 0x20);
        uStack_10d8._0_4_ = (float)uStack_3458;
        uStack_10d8._4_4_ = (float)((ulong)uStack_3458 >> 0x20);
        uStack_10d0._0_4_ = (float)uStack_3450;
        uStack_10d0._4_4_ = (float)((ulong)uStack_3450 >> 0x20);
        uStack_10c8._0_4_ = (float)uStack_3448;
        local_6c0 = (float)local_2000 * (float)local_10e0;
        fStack_6bc = local_2000._4_4_ * local_10e0._4_4_;
        fStack_6b8 = (float)uStack_1ff8 * (float)uStack_10d8;
        fStack_6b4 = uStack_1ff8._4_4_ * uStack_10d8._4_4_;
        fStack_6b0 = (float)uStack_1ff0 * (float)uStack_10d0;
        fStack_6ac = uStack_1ff0._4_4_ * uStack_10d0._4_4_;
        fStack_6a8 = (float)uStack_1fe8 * (float)uStack_10c8;
        local_31a0 = CONCAT44(fStack_6bc + fVar50,local_6c0 + fVar42);
        uStack_3198 = CONCAT44(fStack_6b4 + fVar66,fStack_6b8 + fVar58);
        uStack_3190 = CONCAT44(fStack_6ac + fVar82,fStack_6b0 + fVar74);
        uStack_3188 = CONCAT44(uStack_1fe8._4_4_ + fVar98,fStack_6a8 + fVar90);
        local_2060._0_4_ = (float)local_3440;
        local_1080 = (float)local_2060;
        local_2060._4_4_ = (float)((ulong)local_3440 >> 0x20);
        fStack_107c = local_2060._4_4_;
        uStack_2058._0_4_ = (float)uStack_3438;
        fStack_1078 = (float)uStack_2058;
        uStack_2058._4_4_ = (float)((ulong)uStack_3438 >> 0x20);
        fStack_1074 = uStack_2058._4_4_;
        uStack_2050._0_4_ = (float)uStack_3430;
        fStack_1070 = (float)uStack_2050;
        uStack_2050._4_4_ = (float)((ulong)uStack_3430 >> 0x20);
        fStack_106c = uStack_2050._4_4_;
        uStack_2048._0_4_ = (float)uStack_3428;
        fStack_1068 = (float)uStack_2048;
        uStack_2048._4_4_ = (float)((ulong)uStack_3428 >> 0x20);
        fStack_1064 = uStack_2048._4_4_;
        local_10a0._0_4_ = (float)local_3480;
        local_10a0._4_4_ = (float)((ulong)local_3480 >> 0x20);
        uStack_1098._0_4_ = (float)uStack_3478;
        uStack_1098._4_4_ = (float)((ulong)uStack_3478 >> 0x20);
        uStack_1090._0_4_ = (float)uStack_3470;
        uStack_1090._4_4_ = (float)((ulong)uStack_3470 >> 0x20);
        uStack_1088._0_4_ = (float)uStack_3468;
        local_680 = (float)local_2060 * (float)local_10a0;
        fStack_67c = local_2060._4_4_ * local_10a0._4_4_;
        fStack_678 = (float)uStack_2058 * (float)uStack_1098;
        fStack_674 = uStack_2058._4_4_ * uStack_1098._4_4_;
        fStack_670 = (float)uStack_2050 * (float)uStack_1090;
        fStack_66c = uStack_2050._4_4_ * uStack_1090._4_4_;
        fStack_668 = (float)uStack_2048 * (float)uStack_1088;
        local_31c0 = CONCAT44(fStack_67c + fVar51,local_680 + fVar43);
        uStack_31b8 = CONCAT44(fStack_674 + fVar67,fStack_678 + fVar59);
        uStack_31b0 = CONCAT44(fStack_66c + fVar83,fStack_670 + fVar75);
        uStack_31a8 = CONCAT44(uStack_2048._4_4_ + fVar99,fStack_668 + fVar91);
        local_1040 = (float)local_2000;
        fStack_103c = local_2000._4_4_;
        fStack_1038 = (float)uStack_1ff8;
        fStack_1034 = uStack_1ff8._4_4_;
        fStack_1030 = (float)uStack_1ff0;
        fStack_102c = uStack_1ff0._4_4_;
        fStack_1028 = (float)uStack_1fe8;
        fStack_1024 = uStack_1fe8._4_4_;
        local_1060._0_4_ = (float)local_34a0;
        local_1060._4_4_ = (float)((ulong)local_34a0 >> 0x20);
        uStack_1058._0_4_ = (float)uStack_3498;
        uStack_1058._4_4_ = (float)((ulong)uStack_3498 >> 0x20);
        uStack_1050._0_4_ = (float)uStack_3490;
        uStack_1050._4_4_ = (float)((ulong)uStack_3490 >> 0x20);
        uStack_1048._0_4_ = (float)uStack_3488;
        local_640 = (float)local_2000 * (float)local_1060;
        fStack_63c = local_2000._4_4_ * local_1060._4_4_;
        fStack_638 = (float)uStack_1ff8 * (float)uStack_1058;
        fStack_634 = uStack_1ff8._4_4_ * uStack_1058._4_4_;
        fStack_630 = (float)uStack_1ff0 * (float)uStack_1050;
        fStack_62c = uStack_1ff0._4_4_ * uStack_1050._4_4_;
        fStack_628 = (float)uStack_1fe8 * (float)uStack_1048;
        local_31e0 = CONCAT44(fStack_63c + fVar52,local_640 + fVar44);
        uStack_31d8 = CONCAT44(fStack_634 + fVar68,fStack_638 + fVar60);
        uStack_31d0 = CONCAT44(fStack_62c + fVar84,fStack_630 + fVar76);
        uStack_31c8 = CONCAT44(uStack_1fe8._4_4_ + fVar100,fStack_628 + fVar92);
        local_1000 = (float)local_2060;
        fStack_ffc = local_2060._4_4_;
        fStack_ff8 = (float)uStack_2058;
        fStack_ff4 = uStack_2058._4_4_;
        fStack_ff0 = (float)uStack_2050;
        fStack_fec = uStack_2050._4_4_;
        fStack_fe8 = (float)uStack_2048;
        fStack_fe4 = uStack_2048._4_4_;
        local_1020._0_4_ = (float)local_34c0;
        local_1020._4_4_ = (float)((ulong)local_34c0 >> 0x20);
        uStack_1018._0_4_ = (float)uStack_34b8;
        uStack_1018._4_4_ = (float)((ulong)uStack_34b8 >> 0x20);
        uStack_1010._0_4_ = (float)uStack_34b0;
        uStack_1010._4_4_ = (float)((ulong)uStack_34b0 >> 0x20);
        uStack_1008._0_4_ = (float)uStack_34a8;
        local_600 = (float)local_2060 * (float)local_1020;
        fStack_5fc = local_2060._4_4_ * local_1020._4_4_;
        fStack_5f8 = (float)uStack_2058 * (float)uStack_1018;
        fStack_5f4 = uStack_2058._4_4_ * uStack_1018._4_4_;
        fStack_5f0 = (float)uStack_2050 * (float)uStack_1010;
        fStack_5ec = uStack_2050._4_4_ * uStack_1010._4_4_;
        fStack_5e8 = (float)uStack_2048 * (float)uStack_1008;
        local_3200 = CONCAT44(fStack_5fc + fVar53,local_600 + fVar45);
        uStack_31f8 = CONCAT44(fStack_5f4 + fVar69,fStack_5f8 + fVar61);
        uStack_31f0 = CONCAT44(fStack_5ec + fVar85,fStack_5f0 + fVar77);
        uStack_31e8 = CONCAT44(uStack_2048._4_4_ + fVar101,fStack_5e8 + fVar93);
        local_fc0 = (float)local_2000;
        fStack_fbc = local_2000._4_4_;
        fStack_fb8 = (float)uStack_1ff8;
        fStack_fb4 = uStack_1ff8._4_4_;
        fStack_fb0 = (float)uStack_1ff0;
        fStack_fac = uStack_1ff0._4_4_;
        fStack_fa8 = (float)uStack_1fe8;
        fStack_fa4 = uStack_1fe8._4_4_;
        local_fe0._0_4_ = (float)local_34e0;
        local_fe0._4_4_ = (float)((ulong)local_34e0 >> 0x20);
        uStack_fd8._0_4_ = (float)uStack_34d8;
        uStack_fd8._4_4_ = (float)((ulong)uStack_34d8 >> 0x20);
        uStack_fd0._0_4_ = (float)uStack_34d0;
        uStack_fd0._4_4_ = (float)((ulong)uStack_34d0 >> 0x20);
        uStack_fc8._0_4_ = (float)uStack_34c8;
        local_5c0 = (float)local_2000 * (float)local_fe0;
        fStack_5bc = local_2000._4_4_ * local_fe0._4_4_;
        fStack_5b8 = (float)uStack_1ff8 * (float)uStack_fd8;
        fStack_5b4 = uStack_1ff8._4_4_ * uStack_fd8._4_4_;
        fStack_5b0 = (float)uStack_1ff0 * (float)uStack_fd0;
        fStack_5ac = uStack_1ff0._4_4_ * uStack_fd0._4_4_;
        fStack_5a8 = (float)uStack_1fe8 * (float)uStack_fc8;
        local_3220 = CONCAT44(fStack_5bc + fVar54,local_5c0 + fVar46);
        uStack_3218 = CONCAT44(fStack_5b4 + fVar70,fStack_5b8 + fVar62);
        uStack_3210 = CONCAT44(fStack_5ac + fVar86,fStack_5b0 + fVar78);
        uStack_3208 = CONCAT44(uStack_1fe8._4_4_ + fVar102,fStack_5a8 + fVar94);
        local_f80 = (float)local_2060;
        fStack_f7c = local_2060._4_4_;
        fStack_f78 = (float)uStack_2058;
        fStack_f74 = uStack_2058._4_4_;
        fStack_f70 = (float)uStack_2050;
        fStack_f6c = uStack_2050._4_4_;
        fStack_f68 = (float)uStack_2048;
        fStack_f64 = uStack_2048._4_4_;
        local_fa0._0_4_ = (float)local_3500;
        local_fa0._4_4_ = (float)((ulong)local_3500 >> 0x20);
        uStack_f98._0_4_ = (float)uStack_34f8;
        uStack_f98._4_4_ = (float)((ulong)uStack_34f8 >> 0x20);
        uStack_f90._0_4_ = (float)uStack_34f0;
        uStack_f90._4_4_ = (float)((ulong)uStack_34f0 >> 0x20);
        uStack_f88._0_4_ = (float)uStack_34e8;
        local_580 = (float)local_2060 * (float)local_fa0;
        fStack_57c = local_2060._4_4_ * local_fa0._4_4_;
        fStack_578 = (float)uStack_2058 * (float)uStack_f98;
        fStack_574 = uStack_2058._4_4_ * uStack_f98._4_4_;
        fStack_570 = (float)uStack_2050 * (float)uStack_f90;
        fStack_56c = uStack_2050._4_4_ * uStack_f90._4_4_;
        fStack_568 = (float)uStack_2048 * (float)uStack_f88;
        local_3240 = CONCAT44(fStack_57c + fVar55,local_580 + fVar47);
        uStack_3238 = CONCAT44(fStack_574 + fVar71,fStack_578 + fVar63);
        uStack_3230 = CONCAT44(fStack_56c + fVar87,fStack_570 + fVar79);
        uStack_3228 = CONCAT44(uStack_2048._4_4_ + fVar103,fStack_568 + fVar95);
        local_f40 = (float)local_2000;
        fStack_f3c = local_2000._4_4_;
        fStack_f38 = (float)uStack_1ff8;
        fStack_f34 = uStack_1ff8._4_4_;
        fStack_f30 = (float)uStack_1ff0;
        fStack_f2c = uStack_1ff0._4_4_;
        fStack_f28 = (float)uStack_1fe8;
        fStack_f24 = uStack_1fe8._4_4_;
        local_f60._0_4_ = (float)local_3520;
        local_f60._4_4_ = (float)((ulong)local_3520 >> 0x20);
        uStack_f58._0_4_ = (float)uStack_3518;
        uStack_f58._4_4_ = (float)((ulong)uStack_3518 >> 0x20);
        uStack_f50._0_4_ = (float)uStack_3510;
        uStack_f50._4_4_ = (float)((ulong)uStack_3510 >> 0x20);
        uStack_f48._0_4_ = (float)uStack_3508;
        local_540 = (float)local_2000 * (float)local_f60;
        fStack_53c = local_2000._4_4_ * local_f60._4_4_;
        fStack_538 = (float)uStack_1ff8 * (float)uStack_f58;
        fStack_534 = uStack_1ff8._4_4_ * uStack_f58._4_4_;
        fStack_530 = (float)uStack_1ff0 * (float)uStack_f50;
        fStack_52c = uStack_1ff0._4_4_ * uStack_f50._4_4_;
        fStack_528 = (float)uStack_1fe8 * (float)uStack_f48;
        local_3260 = CONCAT44(fStack_53c + fVar56,local_540 + fVar48);
        uStack_3258 = CONCAT44(fStack_534 + fVar72,fStack_538 + fVar64);
        uStack_3250 = CONCAT44(fStack_52c + fVar88,fStack_530 + fVar80);
        uStack_3248 = CONCAT44(uStack_1fe8._4_4_ + uStack_1ce8._4_4_,fStack_528 + fVar96);
        local_f00 = (float)local_2060;
        fStack_efc = local_2060._4_4_;
        fStack_ef8 = (float)uStack_2058;
        fStack_ef4 = uStack_2058._4_4_;
        fStack_ef0 = (float)uStack_2050;
        fStack_eec = uStack_2050._4_4_;
        fStack_ee8 = (float)uStack_2048;
        fStack_ee4 = uStack_2048._4_4_;
        local_f20._0_4_ = (float)local_3540;
        local_f20._4_4_ = (float)((ulong)local_3540 >> 0x20);
        uStack_f18._0_4_ = (float)uStack_3538;
        uStack_f18._4_4_ = (float)((ulong)uStack_3538 >> 0x20);
        uStack_f10._0_4_ = (float)uStack_3530;
        uStack_f10._4_4_ = (float)((ulong)uStack_3530 >> 0x20);
        uStack_f08._0_4_ = (float)uStack_3528;
        local_500 = (float)local_2060 * (float)local_f20;
        fStack_4fc = local_2060._4_4_ * local_f20._4_4_;
        fStack_4f8 = (float)uStack_2058 * (float)uStack_f18;
        fStack_4f4 = uStack_2058._4_4_ * uStack_f18._4_4_;
        fStack_4f0 = (float)uStack_2050 * (float)uStack_f10;
        fStack_4ec = uStack_2050._4_4_ * uStack_f10._4_4_;
        fStack_4e8 = (float)uStack_2048 * (float)uStack_f08;
        local_3280 = CONCAT44(fStack_4fc + fVar57,local_500 + fVar49);
        uStack_3278 = CONCAT44(fStack_4f4 + fVar73,fStack_4f8 + fVar65);
        uStack_3270 = CONCAT44(fStack_4ec + fVar89,fStack_4f0 + fVar81);
        uStack_3268 = CONCAT44(uStack_2048._4_4_ + uStack_1d48._4_4_,fStack_4e8 + fVar97);
        local_2a28 = local_33e8;
        local_22c0 = local_3540;
        uStack_22b8 = uStack_3538;
        uStack_22b0 = uStack_3530;
        uStack_22a8 = uStack_3528;
        local_22a0 = local_3440;
        uStack_2298 = uStack_3438;
        uStack_2290 = uStack_3430;
        uStack_2288 = uStack_3428;
        local_2260 = local_3520;
        uStack_2258 = uStack_3518;
        uStack_2250 = uStack_3510;
        uStack_2248 = uStack_3508;
        local_2240 = local_3420;
        uStack_2238 = uStack_3418;
        uStack_2230 = uStack_3410;
        uStack_2228 = uStack_3408;
        local_2200 = local_3500;
        uStack_21f8 = uStack_34f8;
        uStack_21f0 = uStack_34f0;
        uStack_21e8 = uStack_34e8;
        local_21e0 = local_3440;
        uStack_21d8 = uStack_3438;
        uStack_21d0 = uStack_3430;
        uStack_21c8 = uStack_3428;
        local_21a0 = local_34e0;
        uStack_2198 = uStack_34d8;
        uStack_2190 = uStack_34d0;
        uStack_2188 = uStack_34c8;
        local_2180 = local_3420;
        uStack_2178 = uStack_3418;
        uStack_2170 = uStack_3410;
        uStack_2168 = uStack_3408;
        local_2140 = local_34c0;
        uStack_2138 = uStack_34b8;
        uStack_2130 = uStack_34b0;
        uStack_2128 = uStack_34a8;
        local_2120 = local_3440;
        uStack_2118 = uStack_3438;
        uStack_2110 = uStack_3430;
        uStack_2108 = uStack_3428;
        local_20e0 = local_34a0;
        uStack_20d8 = uStack_3498;
        uStack_20d0 = uStack_3490;
        uStack_20c8 = uStack_3488;
        local_20c0 = local_3420;
        uStack_20b8 = uStack_3418;
        uStack_20b0 = uStack_3410;
        uStack_20a8 = uStack_3408;
        local_2080 = local_3480;
        uStack_2078 = uStack_3478;
        uStack_2070 = uStack_3470;
        uStack_2068 = uStack_3468;
        local_2060 = local_3440;
        uStack_2058 = uStack_3438;
        uStack_2050 = uStack_3430;
        uStack_2048 = uStack_3428;
        local_2020 = local_3460;
        uStack_2018 = uStack_3458;
        uStack_2010 = uStack_3450;
        uStack_2008 = uStack_3448;
        local_2000 = local_3420;
        uStack_1ff8 = uStack_3418;
        uStack_1ff0 = uStack_3410;
        uStack_1fe8 = uStack_3408;
        local_1ee0 = local_1fa0;
        uStack_1ed8 = uStack_1f98;
        uStack_1ed0 = uStack_1f90;
        uStack_1ec8 = uStack_1f88;
        local_1e80 = local_1f40;
        uStack_1e78 = uStack_1f38;
        uStack_1e70 = uStack_1f30;
        uStack_1e68 = uStack_1f28;
        local_1e20 = local_1fa0;
        uStack_1e18 = uStack_1f98;
        uStack_1e10 = uStack_1f90;
        uStack_1e08 = uStack_1f88;
        local_1dc0 = local_1f40;
        uStack_1db8 = uStack_1f38;
        uStack_1db0 = uStack_1f30;
        uStack_1da8 = uStack_1f28;
        local_1d60 = local_1fa0;
        uStack_1d58 = uStack_1f98;
        uStack_1d50 = uStack_1f90;
        uStack_1d48 = uStack_1f88;
        local_1d00 = local_1f40;
        uStack_1cf8 = uStack_1f38;
        uStack_1cf0 = uStack_1f30;
        uStack_1ce8 = uStack_1f28;
        local_1be0 = local_1ca0;
        uStack_1bd8 = uStack_1c98;
        uStack_1bd0 = uStack_1c90;
        uStack_1bc8 = uStack_1c88;
        local_1b80 = local_1c40;
        uStack_1b78 = uStack_1c38;
        uStack_1b70 = uStack_1c30;
        uStack_1b68 = uStack_1c28;
        local_1b20 = local_1ca0;
        uStack_1b18 = uStack_1c98;
        uStack_1b10 = uStack_1c90;
        uStack_1b08 = uStack_1c88;
        local_1ac0 = local_1c40;
        uStack_1ab8 = uStack_1c38;
        uStack_1ab0 = uStack_1c30;
        uStack_1aa8 = uStack_1c28;
        local_1a60 = local_1ca0;
        uStack_1a58 = uStack_1c98;
        uStack_1a50 = uStack_1c90;
        uStack_1a48 = uStack_1c88;
        local_1a00 = local_1c40;
        uStack_19f8 = uStack_1c38;
        uStack_19f0 = uStack_1c30;
        uStack_19e8 = uStack_1c28;
        local_18e0 = local_19a0;
        uStack_18d8 = uStack_1998;
        uStack_18d0 = uStack_1990;
        uStack_18c8 = uStack_1988;
        local_1880 = local_1940;
        uStack_1878 = uStack_1938;
        uStack_1870 = uStack_1930;
        uStack_1868 = uStack_1928;
        local_1820 = local_19a0;
        uStack_1818 = uStack_1998;
        uStack_1810 = uStack_1990;
        uStack_1808 = uStack_1988;
        local_17c0 = local_1940;
        uStack_17b8 = uStack_1938;
        uStack_17b0 = uStack_1930;
        uStack_17a8 = uStack_1928;
        local_1760 = local_19a0;
        uStack_1758 = uStack_1998;
        uStack_1750 = uStack_1990;
        uStack_1748 = uStack_1988;
        local_1700 = local_1940;
        uStack_16f8 = uStack_1938;
        uStack_16f0 = uStack_1930;
        uStack_16e8 = uStack_1928;
        local_16e0 = local_1720;
        uStack_16d8 = uStack_1718;
        uStack_16d0 = uStack_1710;
        uStack_16c8 = uStack_1708;
        local_16a0 = local_1780;
        uStack_1698 = uStack_1778;
        uStack_1690 = uStack_1770;
        uStack_1688 = uStack_1768;
        local_1660 = local_17e0;
        uStack_1658 = uStack_17d8;
        uStack_1650 = uStack_17d0;
        uStack_1648 = uStack_17c8;
        local_1620 = local_1840;
        uStack_1618 = uStack_1838;
        uStack_1610 = uStack_1830;
        uStack_1608 = uStack_1828;
        local_15e0 = local_18a0;
        uStack_15d8 = uStack_1898;
        uStack_15d0 = uStack_1890;
        uStack_15c8 = uStack_1888;
        local_15a0 = local_1900;
        uStack_1598 = uStack_18f8;
        uStack_1590 = uStack_18f0;
        uStack_1588 = uStack_18e8;
        local_1560 = local_1960;
        uStack_1558 = uStack_1958;
        uStack_1550 = uStack_1950;
        uStack_1548 = uStack_1948;
        local_1520 = local_19c0;
        uStack_1518 = uStack_19b8;
        uStack_1510 = uStack_19b0;
        uStack_1508 = uStack_19a8;
        local_14e0 = local_1a20;
        uStack_14d8 = uStack_1a18;
        uStack_14d0 = uStack_1a10;
        uStack_14c8 = uStack_1a08;
        local_14a0 = local_1a80;
        uStack_1498 = uStack_1a78;
        uStack_1490 = uStack_1a70;
        uStack_1488 = uStack_1a68;
        local_1460 = local_1ae0;
        uStack_1458 = uStack_1ad8;
        uStack_1450 = uStack_1ad0;
        uStack_1448 = uStack_1ac8;
        local_1420 = local_1b40;
        uStack_1418 = uStack_1b38;
        uStack_1410 = uStack_1b30;
        uStack_1408 = uStack_1b28;
        local_13e0 = local_1ba0;
        uStack_13d8 = uStack_1b98;
        uStack_13d0 = uStack_1b90;
        uStack_13c8 = uStack_1b88;
        local_13a0 = local_1c00;
        uStack_1398 = uStack_1bf8;
        uStack_1390 = uStack_1bf0;
        uStack_1388 = uStack_1be8;
        local_1360 = local_1c60;
        uStack_1358 = uStack_1c58;
        uStack_1350 = uStack_1c50;
        uStack_1348 = uStack_1c48;
        local_1320 = local_1cc0;
        uStack_1318 = uStack_1cb8;
        uStack_1310 = uStack_1cb0;
        uStack_1308 = uStack_1ca8;
        local_12e0 = local_1d20;
        uStack_12d8 = uStack_1d18;
        uStack_12d0 = uStack_1d10;
        uStack_12c8 = uStack_1d08;
        local_12a0 = local_1d80;
        uStack_1298 = uStack_1d78;
        uStack_1290 = uStack_1d70;
        uStack_1288 = uStack_1d68;
        local_1260 = local_1de0;
        uStack_1258 = uStack_1dd8;
        uStack_1250 = uStack_1dd0;
        uStack_1248 = uStack_1dc8;
        local_1220 = local_1e40;
        uStack_1218 = uStack_1e38;
        uStack_1210 = uStack_1e30;
        uStack_1208 = uStack_1e28;
        local_11e0 = local_1ea0;
        uStack_11d8 = uStack_1e98;
        uStack_11d0 = uStack_1e90;
        uStack_11c8 = uStack_1e88;
        local_11a0 = local_1f00;
        uStack_1198 = uStack_1ef8;
        uStack_1190 = uStack_1ef0;
        uStack_1188 = uStack_1ee8;
        local_1160 = local_1f60;
        uStack_1158 = uStack_1f58;
        uStack_1150 = uStack_1f50;
        uStack_1148 = uStack_1f48;
        local_1120 = local_1fc0;
        uStack_1118 = uStack_1fb8;
        uStack_1110 = uStack_1fb0;
        uStack_1108 = uStack_1fa8;
        local_10e0 = local_3460;
        uStack_10d8 = uStack_3458;
        uStack_10d0 = uStack_3450;
        uStack_10c8 = uStack_3448;
        local_10a0 = local_3480;
        uStack_1098 = uStack_3478;
        uStack_1090 = uStack_3470;
        uStack_1088 = uStack_3468;
        local_1060 = local_34a0;
        uStack_1058 = uStack_3498;
        uStack_1050 = uStack_3490;
        uStack_1048 = uStack_3488;
        local_1020 = local_34c0;
        uStack_1018 = uStack_34b8;
        uStack_1010 = uStack_34b0;
        uStack_1008 = uStack_34a8;
        local_fe0 = local_34e0;
        uStack_fd8 = uStack_34d8;
        uStack_fd0 = uStack_34d0;
        uStack_fc8 = uStack_34c8;
        local_fa0 = local_3500;
        uStack_f98 = uStack_34f8;
        uStack_f90 = uStack_34f0;
        uStack_f88 = uStack_34e8;
        local_f60 = local_3520;
        uStack_f58 = uStack_3518;
        uStack_f50 = uStack_3510;
        uStack_f48 = uStack_3508;
        local_f20 = local_3540;
        uStack_f18 = uStack_3538;
        uStack_f10 = uStack_3530;
        uStack_f08 = uStack_3528;
        local_ce0 = uVar6;
        uStack_cd8 = uVar7;
        uStack_cd0 = uVar8;
        uStack_cc8 = uVar9;
        fStack_ca4 = fStack_16a4;
        local_ca0 = uVar10;
        uStack_c98 = uVar11;
        uStack_c90 = uVar12;
        uStack_c88 = uVar13;
        fStack_c64 = fStack_1664;
        local_c60 = uVar14;
        uStack_c58 = uVar15;
        uStack_c50 = uVar16;
        uStack_c48 = uVar17;
        fStack_c24 = fStack_1624;
        local_c20 = uVar18;
        uStack_c18 = uVar19;
        uStack_c10 = uVar20;
        uStack_c08 = uVar21;
        fStack_be4 = fStack_15e4;
        local_be0 = uVar22;
        uStack_bd8 = uVar23;
        uStack_bd0 = uVar24;
        uStack_bc8 = uVar25;
        fStack_ba4 = fStack_15a4;
        local_ba0 = uVar26;
        uStack_b98 = uVar27;
        uStack_b90 = uVar28;
        uStack_b88 = uVar29;
        fStack_b64 = fStack_1564;
        local_b60 = uVar30;
        uStack_b58 = uVar31;
        uStack_b50 = uVar32;
        uStack_b48 = uVar33;
        fStack_b24 = fStack_1524;
        local_b20 = uVar34;
        uStack_b18 = uVar35;
        uStack_b10 = uVar36;
        uStack_b08 = uVar37;
        fStack_ae4 = fStack_14e4;
        local_ae0 = local_1a40;
        uStack_ad8 = uStack_1a38;
        uStack_ad0 = uStack_1a30;
        uStack_ac8 = uStack_1a28;
        fStack_aa4 = fStack_14a4;
        local_aa0 = local_1aa0;
        uStack_a98 = uStack_1a98;
        uStack_a90 = uStack_1a90;
        uStack_a88 = uStack_1a88;
        fStack_a64 = fStack_1464;
        local_a60 = local_1b00;
        uStack_a58 = uStack_1af8;
        uStack_a50 = uStack_1af0;
        uStack_a48 = uStack_1ae8;
        fStack_a24 = fStack_1424;
        local_a20 = local_1b60;
        uStack_a18 = uStack_1b58;
        uStack_a10 = uStack_1b50;
        uStack_a08 = uStack_1b48;
        fStack_9e4 = fStack_13e4;
        local_9e0 = local_1bc0;
        uStack_9d8 = uStack_1bb8;
        uStack_9d0 = uStack_1bb0;
        uStack_9c8 = uStack_1ba8;
        fStack_9a4 = fStack_13a4;
        local_9a0 = local_1c20;
        uStack_998 = uStack_1c18;
        uStack_990 = uStack_1c10;
        uStack_988 = uStack_1c08;
        fStack_964 = fStack_1364;
        local_960 = local_1c80;
        uStack_958 = uStack_1c78;
        uStack_950 = uStack_1c70;
        uStack_948 = uStack_1c68;
        fStack_924 = fStack_1324;
        local_920 = local_1ce0;
        uStack_918 = uStack_1cd8;
        uStack_910 = uStack_1cd0;
        uStack_908 = uStack_1cc8;
        fStack_8e4 = fStack_12e4;
        local_8e0 = local_1d40;
        uStack_8d8 = uStack_1d38;
        uStack_8d0 = uStack_1d30;
        uStack_8c8 = uStack_1d28;
        fStack_8a4 = fStack_12a4;
        local_8a0 = local_1da0;
        uStack_898 = uStack_1d98;
        uStack_890 = uStack_1d90;
        uStack_888 = uStack_1d88;
        fStack_864 = fStack_1264;
        local_860 = local_1e00;
        uStack_858 = uStack_1df8;
        uStack_850 = uStack_1df0;
        uStack_848 = uStack_1de8;
        fStack_824 = fStack_1224;
        local_820 = local_1e60;
        uStack_818 = uStack_1e58;
        uStack_810 = uStack_1e50;
        uStack_808 = uStack_1e48;
        fStack_7e4 = fStack_11e4;
        local_7e0 = local_1ec0;
        uStack_7d8 = uStack_1eb8;
        uStack_7d0 = uStack_1eb0;
        uStack_7c8 = uStack_1ea8;
        fStack_7a4 = fStack_11a4;
        local_7a0 = local_1f20;
        uStack_798 = uStack_1f18;
        uStack_790 = uStack_1f10;
        uStack_788 = uStack_1f08;
        fStack_764 = fStack_1164;
        local_760 = local_1f80;
        uStack_758 = uStack_1f78;
        uStack_750 = uStack_1f70;
        uStack_748 = uStack_1f68;
        fStack_724 = fStack_1124;
        local_720 = local_1fe0;
        uStack_718 = uStack_1fd8;
        uStack_710 = uStack_1fd0;
        uStack_708 = uStack_1fc8;
        fStack_6e4 = fStack_10e4;
        local_6e0 = local_2040;
        uStack_6d8 = uStack_2038;
        uStack_6d0 = uStack_2030;
        uStack_6c8 = uStack_2028;
        fStack_6a4 = fStack_10a4;
        local_6a0 = local_20a0;
        uStack_698 = uStack_2098;
        uStack_690 = uStack_2090;
        uStack_688 = uStack_2088;
        fStack_664 = fStack_1064;
        local_660 = local_2100;
        uStack_658 = uStack_20f8;
        uStack_650 = uStack_20f0;
        uStack_648 = uStack_20e8;
        fStack_624 = fStack_1024;
        local_620 = local_2160;
        uStack_618 = uStack_2158;
        uStack_610 = uStack_2150;
        uStack_608 = uStack_2148;
        fStack_5e4 = fStack_fe4;
        local_5e0 = local_21c0;
        uStack_5d8 = uStack_21b8;
        uStack_5d0 = uStack_21b0;
        uStack_5c8 = uStack_21a8;
        fStack_5a4 = fStack_fa4;
        local_5a0 = local_2220;
        uStack_598 = uStack_2218;
        uStack_590 = uStack_2210;
        uStack_588 = uStack_2208;
        fStack_564 = fStack_f64;
        local_560 = local_2280;
        uStack_558 = uStack_2278;
        uStack_550 = uStack_2270;
        uStack_548 = uStack_2268;
        fStack_524 = fStack_f24;
        local_520 = local_22e0;
        uStack_518 = uStack_22d8;
        uStack_510 = uStack_22d0;
        uStack_508 = uStack_22c8;
        fStack_4e4 = fStack_ee4;
      }
      for (; local_3284 < local_2ba4; local_3284 = local_3284 + 1) {
        Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
        pfVar41 = Mat::row(&local_3590,local_314c);
        Mat::~Mat((Mat *)0x346d7d);
        local_3548 = pfVar41;
        local_3598 = Mat::row(&local_3070,local_3284);
        local_35a0 = Mat::row(&local_30b8,local_3284);
        local_35a8 = Mat::row(&local_3100,local_3284);
        local_35b0 = Mat::row(&local_3148,local_3284);
        local_2b28 = local_3548;
        local_35e0 = *(undefined8 *)local_3548;
        uStack_35d8 = *(undefined8 *)(local_3548 + 2);
        uStack_35d0 = *(undefined8 *)(local_3548 + 4);
        uStack_35c8 = *(undefined8 *)(local_3548 + 6);
        local_2b30 = local_3548 + 8;
        local_3600 = *(undefined8 *)local_2b30;
        uStack_35f8 = *(undefined8 *)(local_3548 + 10);
        uStack_35f0 = *(undefined8 *)(local_3548 + 0xc);
        uStack_35e8 = *(undefined8 *)(local_3548 + 0xe);
        local_2b38 = local_3598;
        local_3620 = *(undefined8 *)local_3598;
        uStack_3618 = *(undefined8 *)(local_3598 + 2);
        uStack_3610 = *(undefined8 *)(local_3598 + 4);
        uStack_3608 = *(undefined8 *)(local_3598 + 6);
        local_2b40 = local_3598 + 8;
        local_3640 = *(undefined8 *)local_2b40;
        uStack_3638 = *(undefined8 *)(local_3598 + 10);
        uStack_3630 = *(undefined8 *)(local_3598 + 0xc);
        uStack_3628 = *(undefined8 *)(local_3598 + 0xe);
        local_2b48 = local_35a0;
        local_3660 = *(undefined8 *)local_35a0;
        uStack_3658 = *(undefined8 *)(local_35a0 + 2);
        uStack_3650 = *(undefined8 *)(local_35a0 + 4);
        uStack_3648 = *(undefined8 *)(local_35a0 + 6);
        local_2b50 = local_35a0 + 8;
        local_3680 = *(undefined8 *)local_2b50;
        uStack_3678 = *(undefined8 *)(local_35a0 + 10);
        uStack_3670 = *(undefined8 *)(local_35a0 + 0xc);
        uStack_3668 = *(undefined8 *)(local_35a0 + 0xe);
        local_2b58 = local_35a8;
        local_36a0 = *(undefined8 *)local_35a8;
        uStack_3698 = *(undefined8 *)(local_35a8 + 2);
        uStack_3690 = *(undefined8 *)(local_35a8 + 4);
        uStack_3688 = *(undefined8 *)(local_35a8 + 6);
        local_2b60 = local_35a8 + 8;
        local_36c0 = *(undefined8 *)local_2b60;
        uStack_36b8 = *(undefined8 *)(local_35a8 + 10);
        uStack_36b0 = *(undefined8 *)(local_35a8 + 0xc);
        uStack_36a8 = *(undefined8 *)(local_35a8 + 0xe);
        local_36e0 = *(undefined8 *)local_35b0;
        uStack_36d8 = *(undefined8 *)(local_35b0 + 2);
        uStack_36d0 = *(undefined8 *)(local_35b0 + 4);
        uStack_36c8 = *(undefined8 *)(local_35b0 + 6);
        local_2b70 = local_35b0 + 8;
        local_3700 = *(undefined8 *)local_2b70;
        uStack_36f8 = *(undefined8 *)(local_35b0 + 10);
        uStack_36f0 = *(undefined8 *)(local_35b0 + 0xc);
        uStack_36e8 = *(undefined8 *)(local_35b0 + 0xe);
        local_2340 = local_31a0;
        uStack_2338 = uStack_3198;
        uStack_2330 = uStack_3190;
        uStack_2328 = uStack_3188;
        local_2300._0_4_ = (float)local_35e0;
        local_ec0 = (float)local_2300;
        local_2300._4_4_ = (float)((ulong)local_35e0 >> 0x20);
        fStack_ebc = local_2300._4_4_;
        uStack_22f8._0_4_ = (float)uStack_35d8;
        fStack_eb8 = (float)uStack_22f8;
        uStack_22f8._4_4_ = (float)((ulong)uStack_35d8 >> 0x20);
        fStack_eb4 = uStack_22f8._4_4_;
        uStack_22f0._0_4_ = (float)uStack_35d0;
        fStack_eb0 = (float)uStack_22f0;
        uStack_22f0._4_4_ = (float)((ulong)uStack_35d0 >> 0x20);
        fStack_eac = uStack_22f0._4_4_;
        uStack_22e8._0_4_ = (float)uStack_35c8;
        fStack_ea8 = (float)uStack_22e8;
        uStack_22e8._4_4_ = (float)((ulong)uStack_35c8 >> 0x20);
        fStack_ea4 = uStack_22e8._4_4_;
        local_ee0._0_4_ = (float)local_3620;
        local_ee0._4_4_ = (float)((ulong)local_3620 >> 0x20);
        uStack_ed8._0_4_ = (float)uStack_3618;
        uStack_ed8._4_4_ = (float)((ulong)uStack_3618 >> 0x20);
        uStack_ed0._0_4_ = (float)uStack_3610;
        uStack_ed0._4_4_ = (float)((ulong)uStack_3610 >> 0x20);
        uStack_ec8._0_4_ = (float)uStack_3608;
        local_4c0 = (float)local_2300 * (float)local_ee0;
        fStack_4bc = local_2300._4_4_ * local_ee0._4_4_;
        fStack_4b8 = (float)uStack_22f8 * (float)uStack_ed8;
        fStack_4b4 = uStack_22f8._4_4_ * uStack_ed8._4_4_;
        fStack_4b0 = (float)uStack_22f0 * (float)uStack_ed0;
        fStack_4ac = uStack_22f0._4_4_ * uStack_ed0._4_4_;
        fStack_4a8 = (float)uStack_22e8 * (float)uStack_ec8;
        uVar6 = local_31a0;
        uVar7 = uStack_3198;
        uVar8 = uStack_3190;
        uVar9 = uStack_3188;
        local_4e0._0_4_ = (float)local_31a0;
        local_4e0._4_4_ = (float)((ulong)local_31a0 >> 0x20);
        uStack_4d8._0_4_ = (float)uStack_3198;
        uStack_4d8._4_4_ = (float)((ulong)uStack_3198 >> 0x20);
        uStack_4d0._0_4_ = (float)uStack_3190;
        uStack_4d0._4_4_ = (float)((ulong)uStack_3190 >> 0x20);
        uStack_4c8._0_4_ = (float)uStack_3188;
        uStack_4c8._4_4_ = (float)((ulong)uStack_3188 >> 0x20);
        local_31a0 = CONCAT44(fStack_4bc + local_4e0._4_4_,local_4c0 + (float)local_4e0);
        uStack_3198 = CONCAT44(fStack_4b4 + uStack_4d8._4_4_,fStack_4b8 + (float)uStack_4d8);
        uStack_3190 = CONCAT44(fStack_4ac + uStack_4d0._4_4_,fStack_4b0 + (float)uStack_4d0);
        uStack_3188 = CONCAT44(uStack_22e8._4_4_ + uStack_4c8._4_4_,fStack_4a8 + (float)uStack_4c8);
        local_23a0 = local_31c0;
        uStack_2398 = uStack_31b8;
        uStack_2390 = uStack_31b0;
        uStack_2388 = uStack_31a8;
        local_2360._0_4_ = (float)local_3600;
        local_e80 = (float)local_2360;
        local_2360._4_4_ = (float)((ulong)local_3600 >> 0x20);
        fStack_e7c = local_2360._4_4_;
        uStack_2358._0_4_ = (float)uStack_35f8;
        fStack_e78 = (float)uStack_2358;
        uStack_2358._4_4_ = (float)((ulong)uStack_35f8 >> 0x20);
        fStack_e74 = uStack_2358._4_4_;
        uStack_2350._0_4_ = (float)uStack_35f0;
        fStack_e70 = (float)uStack_2350;
        uStack_2350._4_4_ = (float)((ulong)uStack_35f0 >> 0x20);
        fStack_e6c = uStack_2350._4_4_;
        uStack_2348._0_4_ = (float)uStack_35e8;
        fStack_e68 = (float)uStack_2348;
        uStack_2348._4_4_ = (float)((ulong)uStack_35e8 >> 0x20);
        fStack_e64 = uStack_2348._4_4_;
        local_ea0._0_4_ = (float)local_3640;
        local_ea0._4_4_ = (float)((ulong)local_3640 >> 0x20);
        uStack_e98._0_4_ = (float)uStack_3638;
        uStack_e98._4_4_ = (float)((ulong)uStack_3638 >> 0x20);
        uStack_e90._0_4_ = (float)uStack_3630;
        uStack_e90._4_4_ = (float)((ulong)uStack_3630 >> 0x20);
        uStack_e88._0_4_ = (float)uStack_3628;
        local_480 = (float)local_2360 * (float)local_ea0;
        fStack_47c = local_2360._4_4_ * local_ea0._4_4_;
        fStack_478 = (float)uStack_2358 * (float)uStack_e98;
        fStack_474 = uStack_2358._4_4_ * uStack_e98._4_4_;
        fStack_470 = (float)uStack_2350 * (float)uStack_e90;
        fStack_46c = uStack_2350._4_4_ * uStack_e90._4_4_;
        fStack_468 = (float)uStack_2348 * (float)uStack_e88;
        uVar10 = local_31c0;
        uVar11 = uStack_31b8;
        uVar12 = uStack_31b0;
        uVar13 = uStack_31a8;
        local_4a0._0_4_ = (float)local_31c0;
        local_4a0._4_4_ = (float)((ulong)local_31c0 >> 0x20);
        uStack_498._0_4_ = (float)uStack_31b8;
        uStack_498._4_4_ = (float)((ulong)uStack_31b8 >> 0x20);
        uStack_490._0_4_ = (float)uStack_31b0;
        uStack_490._4_4_ = (float)((ulong)uStack_31b0 >> 0x20);
        uStack_488._0_4_ = (float)uStack_31a8;
        uStack_488._4_4_ = (float)((ulong)uStack_31a8 >> 0x20);
        local_31c0 = CONCAT44(fStack_47c + local_4a0._4_4_,local_480 + (float)local_4a0);
        uStack_31b8 = CONCAT44(fStack_474 + uStack_498._4_4_,fStack_478 + (float)uStack_498);
        uStack_31b0 = CONCAT44(fStack_46c + uStack_490._4_4_,fStack_470 + (float)uStack_490);
        uStack_31a8 = CONCAT44(uStack_2348._4_4_ + uStack_488._4_4_,fStack_468 + (float)uStack_488);
        local_2400 = local_31e0;
        uStack_23f8 = uStack_31d8;
        uStack_23f0 = uStack_31d0;
        uStack_23e8 = uStack_31c8;
        local_e40 = (float)local_2300;
        fStack_e3c = local_2300._4_4_;
        fStack_e38 = (float)uStack_22f8;
        fStack_e34 = uStack_22f8._4_4_;
        fStack_e30 = (float)uStack_22f0;
        fStack_e2c = uStack_22f0._4_4_;
        fStack_e28 = (float)uStack_22e8;
        fStack_e24 = uStack_22e8._4_4_;
        local_e60._0_4_ = (float)local_3660;
        local_e60._4_4_ = (float)((ulong)local_3660 >> 0x20);
        uStack_e58._0_4_ = (float)uStack_3658;
        uStack_e58._4_4_ = (float)((ulong)uStack_3658 >> 0x20);
        uStack_e50._0_4_ = (float)uStack_3650;
        uStack_e50._4_4_ = (float)((ulong)uStack_3650 >> 0x20);
        uStack_e48._0_4_ = (float)uStack_3648;
        local_440 = (float)local_2300 * (float)local_e60;
        fStack_43c = local_2300._4_4_ * local_e60._4_4_;
        fStack_438 = (float)uStack_22f8 * (float)uStack_e58;
        fStack_434 = uStack_22f8._4_4_ * uStack_e58._4_4_;
        fStack_430 = (float)uStack_22f0 * (float)uStack_e50;
        fStack_42c = uStack_22f0._4_4_ * uStack_e50._4_4_;
        fStack_428 = (float)uStack_22e8 * (float)uStack_e48;
        uVar14 = local_31e0;
        uVar15 = uStack_31d8;
        uVar16 = uStack_31d0;
        uVar17 = uStack_31c8;
        local_460._0_4_ = (float)local_31e0;
        local_460._4_4_ = (float)((ulong)local_31e0 >> 0x20);
        uStack_458._0_4_ = (float)uStack_31d8;
        uStack_458._4_4_ = (float)((ulong)uStack_31d8 >> 0x20);
        uStack_450._0_4_ = (float)uStack_31d0;
        uStack_450._4_4_ = (float)((ulong)uStack_31d0 >> 0x20);
        uStack_448._0_4_ = (float)uStack_31c8;
        uStack_448._4_4_ = (float)((ulong)uStack_31c8 >> 0x20);
        local_31e0 = CONCAT44(fStack_43c + local_460._4_4_,local_440 + (float)local_460);
        uStack_31d8 = CONCAT44(fStack_434 + uStack_458._4_4_,fStack_438 + (float)uStack_458);
        uStack_31d0 = CONCAT44(fStack_42c + uStack_450._4_4_,fStack_430 + (float)uStack_450);
        uStack_31c8 = CONCAT44(uStack_22e8._4_4_ + uStack_448._4_4_,fStack_428 + (float)uStack_448);
        local_2460 = local_3200;
        uStack_2458 = uStack_31f8;
        uStack_2450 = uStack_31f0;
        uStack_2448 = uStack_31e8;
        local_e00 = (float)local_2360;
        fStack_dfc = local_2360._4_4_;
        fStack_df8 = (float)uStack_2358;
        fStack_df4 = uStack_2358._4_4_;
        fStack_df0 = (float)uStack_2350;
        fStack_dec = uStack_2350._4_4_;
        fStack_de8 = (float)uStack_2348;
        fStack_de4 = uStack_2348._4_4_;
        local_e20._0_4_ = (float)local_3680;
        local_e20._4_4_ = (float)((ulong)local_3680 >> 0x20);
        uStack_e18._0_4_ = (float)uStack_3678;
        uStack_e18._4_4_ = (float)((ulong)uStack_3678 >> 0x20);
        uStack_e10._0_4_ = (float)uStack_3670;
        uStack_e10._4_4_ = (float)((ulong)uStack_3670 >> 0x20);
        uStack_e08._0_4_ = (float)uStack_3668;
        local_400 = (float)local_2360 * (float)local_e20;
        fStack_3fc = local_2360._4_4_ * local_e20._4_4_;
        fStack_3f8 = (float)uStack_2358 * (float)uStack_e18;
        fStack_3f4 = uStack_2358._4_4_ * uStack_e18._4_4_;
        fStack_3f0 = (float)uStack_2350 * (float)uStack_e10;
        fStack_3ec = uStack_2350._4_4_ * uStack_e10._4_4_;
        fStack_3e8 = (float)uStack_2348 * (float)uStack_e08;
        uVar18 = local_3200;
        uVar19 = uStack_31f8;
        uVar20 = uStack_31f0;
        uVar21 = uStack_31e8;
        local_420._0_4_ = (float)local_3200;
        local_420._4_4_ = (float)((ulong)local_3200 >> 0x20);
        uStack_418._0_4_ = (float)uStack_31f8;
        uStack_418._4_4_ = (float)((ulong)uStack_31f8 >> 0x20);
        uStack_410._0_4_ = (float)uStack_31f0;
        uStack_410._4_4_ = (float)((ulong)uStack_31f0 >> 0x20);
        uStack_408._0_4_ = (float)uStack_31e8;
        uStack_408._4_4_ = (float)((ulong)uStack_31e8 >> 0x20);
        local_3200 = CONCAT44(fStack_3fc + local_420._4_4_,local_400 + (float)local_420);
        uStack_31f8 = CONCAT44(fStack_3f4 + uStack_418._4_4_,fStack_3f8 + (float)uStack_418);
        uStack_31f0 = CONCAT44(fStack_3ec + uStack_410._4_4_,fStack_3f0 + (float)uStack_410);
        uStack_31e8 = CONCAT44(uStack_2348._4_4_ + uStack_408._4_4_,fStack_3e8 + (float)uStack_408);
        local_24c0 = local_3220;
        uStack_24b8 = uStack_3218;
        uStack_24b0 = uStack_3210;
        uStack_24a8 = uStack_3208;
        local_dc0 = (float)local_2300;
        fStack_dbc = local_2300._4_4_;
        fStack_db8 = (float)uStack_22f8;
        fStack_db4 = uStack_22f8._4_4_;
        fStack_db0 = (float)uStack_22f0;
        fStack_dac = uStack_22f0._4_4_;
        fStack_da8 = (float)uStack_22e8;
        fStack_da4 = uStack_22e8._4_4_;
        local_de0._0_4_ = (float)local_36a0;
        local_de0._4_4_ = (float)((ulong)local_36a0 >> 0x20);
        uStack_dd8._0_4_ = (float)uStack_3698;
        uStack_dd8._4_4_ = (float)((ulong)uStack_3698 >> 0x20);
        uStack_dd0._0_4_ = (float)uStack_3690;
        uStack_dd0._4_4_ = (float)((ulong)uStack_3690 >> 0x20);
        uStack_dc8._0_4_ = (float)uStack_3688;
        local_3c0 = (float)local_2300 * (float)local_de0;
        fStack_3bc = local_2300._4_4_ * local_de0._4_4_;
        fStack_3b8 = (float)uStack_22f8 * (float)uStack_dd8;
        fStack_3b4 = uStack_22f8._4_4_ * uStack_dd8._4_4_;
        fStack_3b0 = (float)uStack_22f0 * (float)uStack_dd0;
        fStack_3ac = uStack_22f0._4_4_ * uStack_dd0._4_4_;
        fStack_3a8 = (float)uStack_22e8 * (float)uStack_dc8;
        uVar22 = local_3220;
        uVar23 = uStack_3218;
        uVar24 = uStack_3210;
        uVar25 = uStack_3208;
        local_3e0._0_4_ = (float)local_3220;
        local_3e0._4_4_ = (float)((ulong)local_3220 >> 0x20);
        uStack_3d8._0_4_ = (float)uStack_3218;
        uStack_3d8._4_4_ = (float)((ulong)uStack_3218 >> 0x20);
        uStack_3d0._0_4_ = (float)uStack_3210;
        uStack_3d0._4_4_ = (float)((ulong)uStack_3210 >> 0x20);
        uStack_3c8._0_4_ = (float)uStack_3208;
        uStack_3c8._4_4_ = (float)((ulong)uStack_3208 >> 0x20);
        local_3220 = CONCAT44(fStack_3bc + local_3e0._4_4_,local_3c0 + (float)local_3e0);
        uStack_3218 = CONCAT44(fStack_3b4 + uStack_3d8._4_4_,fStack_3b8 + (float)uStack_3d8);
        uStack_3210 = CONCAT44(fStack_3ac + uStack_3d0._4_4_,fStack_3b0 + (float)uStack_3d0);
        uStack_3208 = CONCAT44(uStack_22e8._4_4_ + uStack_3c8._4_4_,fStack_3a8 + (float)uStack_3c8);
        local_2520 = local_3240;
        uStack_2518 = uStack_3238;
        uStack_2510 = uStack_3230;
        uStack_2508 = uStack_3228;
        local_d80 = (float)local_2360;
        fStack_d7c = local_2360._4_4_;
        fStack_d78 = (float)uStack_2358;
        fStack_d74 = uStack_2358._4_4_;
        fStack_d70 = (float)uStack_2350;
        fStack_d6c = uStack_2350._4_4_;
        fStack_d68 = (float)uStack_2348;
        fStack_d64 = uStack_2348._4_4_;
        local_da0._0_4_ = (float)local_36c0;
        local_da0._4_4_ = (float)((ulong)local_36c0 >> 0x20);
        uStack_d98._0_4_ = (float)uStack_36b8;
        uStack_d98._4_4_ = (float)((ulong)uStack_36b8 >> 0x20);
        uStack_d90._0_4_ = (float)uStack_36b0;
        uStack_d90._4_4_ = (float)((ulong)uStack_36b0 >> 0x20);
        uStack_d88._0_4_ = (float)uStack_36a8;
        local_380 = (float)local_2360 * (float)local_da0;
        fStack_37c = local_2360._4_4_ * local_da0._4_4_;
        fStack_378 = (float)uStack_2358 * (float)uStack_d98;
        fStack_374 = uStack_2358._4_4_ * uStack_d98._4_4_;
        fStack_370 = (float)uStack_2350 * (float)uStack_d90;
        fStack_36c = uStack_2350._4_4_ * uStack_d90._4_4_;
        fStack_368 = (float)uStack_2348 * (float)uStack_d88;
        uVar26 = local_3240;
        uVar27 = uStack_3238;
        uVar28 = uStack_3230;
        uVar29 = uStack_3228;
        local_3a0._0_4_ = (float)local_3240;
        local_3a0._4_4_ = (float)((ulong)local_3240 >> 0x20);
        uStack_398._0_4_ = (float)uStack_3238;
        uStack_398._4_4_ = (float)((ulong)uStack_3238 >> 0x20);
        uStack_390._0_4_ = (float)uStack_3230;
        uStack_390._4_4_ = (float)((ulong)uStack_3230 >> 0x20);
        uStack_388._0_4_ = (float)uStack_3228;
        uStack_388._4_4_ = (float)((ulong)uStack_3228 >> 0x20);
        local_3240 = CONCAT44(fStack_37c + local_3a0._4_4_,local_380 + (float)local_3a0);
        uStack_3238 = CONCAT44(fStack_374 + uStack_398._4_4_,fStack_378 + (float)uStack_398);
        uStack_3230 = CONCAT44(fStack_36c + uStack_390._4_4_,fStack_370 + (float)uStack_390);
        uStack_3228 = CONCAT44(uStack_2348._4_4_ + uStack_388._4_4_,fStack_368 + (float)uStack_388);
        local_2580 = local_3260;
        uStack_2578 = uStack_3258;
        uStack_2570 = uStack_3250;
        uStack_2568 = uStack_3248;
        local_d40 = (float)local_2300;
        fStack_d3c = local_2300._4_4_;
        fStack_d38 = (float)uStack_22f8;
        fStack_d34 = uStack_22f8._4_4_;
        fStack_d30 = (float)uStack_22f0;
        fStack_d2c = uStack_22f0._4_4_;
        fStack_d28 = (float)uStack_22e8;
        fStack_d24 = uStack_22e8._4_4_;
        local_d60._0_4_ = (float)local_36e0;
        local_d60._4_4_ = (float)((ulong)local_36e0 >> 0x20);
        uStack_d58._0_4_ = (float)uStack_36d8;
        uStack_d58._4_4_ = (float)((ulong)uStack_36d8 >> 0x20);
        uStack_d50._0_4_ = (float)uStack_36d0;
        uStack_d50._4_4_ = (float)((ulong)uStack_36d0 >> 0x20);
        uStack_d48._0_4_ = (float)uStack_36c8;
        local_340 = (float)local_2300 * (float)local_d60;
        fStack_33c = local_2300._4_4_ * local_d60._4_4_;
        fStack_338 = (float)uStack_22f8 * (float)uStack_d58;
        fStack_334 = uStack_22f8._4_4_ * uStack_d58._4_4_;
        fStack_330 = (float)uStack_22f0 * (float)uStack_d50;
        fStack_32c = uStack_22f0._4_4_ * uStack_d50._4_4_;
        fStack_328 = (float)uStack_22e8 * (float)uStack_d48;
        uVar30 = local_3260;
        uVar31 = uStack_3258;
        uVar32 = uStack_3250;
        uVar33 = uStack_3248;
        local_360._0_4_ = (float)local_3260;
        local_360._4_4_ = (float)((ulong)local_3260 >> 0x20);
        uStack_358._0_4_ = (float)uStack_3258;
        uStack_358._4_4_ = (float)((ulong)uStack_3258 >> 0x20);
        uStack_350._0_4_ = (float)uStack_3250;
        uStack_350._4_4_ = (float)((ulong)uStack_3250 >> 0x20);
        uStack_348._0_4_ = (float)uStack_3248;
        uStack_348._4_4_ = (float)((ulong)uStack_3248 >> 0x20);
        local_3260 = CONCAT44(fStack_33c + local_360._4_4_,local_340 + (float)local_360);
        uStack_3258 = CONCAT44(fStack_334 + uStack_358._4_4_,fStack_338 + (float)uStack_358);
        uStack_3250 = CONCAT44(fStack_32c + uStack_350._4_4_,fStack_330 + (float)uStack_350);
        uStack_3248 = CONCAT44(uStack_22e8._4_4_ + uStack_348._4_4_,fStack_328 + (float)uStack_348);
        local_25e0 = local_3280;
        uStack_25d8 = uStack_3278;
        uStack_25d0 = uStack_3270;
        uStack_25c8 = uStack_3268;
        local_d00 = (float)local_2360;
        fStack_cfc = local_2360._4_4_;
        fStack_cf8 = (float)uStack_2358;
        fStack_cf4 = uStack_2358._4_4_;
        fStack_cf0 = (float)uStack_2350;
        fStack_cec = uStack_2350._4_4_;
        fStack_ce8 = (float)uStack_2348;
        fStack_ce4 = uStack_2348._4_4_;
        local_d20._0_4_ = (float)local_3700;
        local_d20._4_4_ = (float)((ulong)local_3700 >> 0x20);
        uStack_d18._0_4_ = (float)uStack_36f8;
        uStack_d18._4_4_ = (float)((ulong)uStack_36f8 >> 0x20);
        uStack_d10._0_4_ = (float)uStack_36f0;
        uStack_d10._4_4_ = (float)((ulong)uStack_36f0 >> 0x20);
        uStack_d08._0_4_ = (float)uStack_36e8;
        local_300 = (float)local_2360 * (float)local_d20;
        fStack_2fc = local_2360._4_4_ * local_d20._4_4_;
        fStack_2f8 = (float)uStack_2358 * (float)uStack_d18;
        fStack_2f4 = uStack_2358._4_4_ * uStack_d18._4_4_;
        fStack_2f0 = (float)uStack_2350 * (float)uStack_d10;
        fStack_2ec = uStack_2350._4_4_ * uStack_d10._4_4_;
        fStack_2e8 = (float)uStack_2348 * (float)uStack_d08;
        uVar34 = local_3280;
        uVar35 = uStack_3278;
        uVar36 = uStack_3270;
        uVar37 = uStack_3268;
        local_320._0_4_ = (float)local_3280;
        local_320._4_4_ = (float)((ulong)local_3280 >> 0x20);
        uStack_318._0_4_ = (float)uStack_3278;
        uStack_318._4_4_ = (float)((ulong)uStack_3278 >> 0x20);
        uStack_310._0_4_ = (float)uStack_3270;
        uStack_310._4_4_ = (float)((ulong)uStack_3270 >> 0x20);
        uStack_308._0_4_ = (float)uStack_3268;
        uStack_308._4_4_ = (float)((ulong)uStack_3268 >> 0x20);
        in_stack_ffffffffffffbe48 = fStack_2f8 + (float)uStack_318;
        in_stack_ffffffffffffbe4c = fStack_2f4 + uStack_318._4_4_;
        local_3280 = CONCAT44(fStack_2fc + local_320._4_4_,local_300 + (float)local_320);
        uStack_3278 = CONCAT44(in_stack_ffffffffffffbe4c,in_stack_ffffffffffffbe48);
        uStack_3270 = CONCAT44(fStack_2ec + uStack_310._4_4_,fStack_2f0 + (float)uStack_310);
        uStack_3268 = CONCAT44(uStack_2348._4_4_ + uStack_308._4_4_,fStack_2e8 + (float)uStack_308);
        local_2b68 = local_35b0;
        local_25c0 = local_3700;
        uStack_25b8 = uStack_36f8;
        uStack_25b0 = uStack_36f0;
        uStack_25a8 = uStack_36e8;
        local_25a0 = local_3600;
        uStack_2598 = uStack_35f8;
        uStack_2590 = uStack_35f0;
        uStack_2588 = uStack_35e8;
        local_2560 = local_36e0;
        uStack_2558 = uStack_36d8;
        uStack_2550 = uStack_36d0;
        uStack_2548 = uStack_36c8;
        local_2540 = local_35e0;
        uStack_2538 = uStack_35d8;
        uStack_2530 = uStack_35d0;
        uStack_2528 = uStack_35c8;
        local_2500 = local_36c0;
        uStack_24f8 = uStack_36b8;
        uStack_24f0 = uStack_36b0;
        uStack_24e8 = uStack_36a8;
        local_24e0 = local_3600;
        uStack_24d8 = uStack_35f8;
        uStack_24d0 = uStack_35f0;
        uStack_24c8 = uStack_35e8;
        local_24a0 = local_36a0;
        uStack_2498 = uStack_3698;
        uStack_2490 = uStack_3690;
        uStack_2488 = uStack_3688;
        local_2480 = local_35e0;
        uStack_2478 = uStack_35d8;
        uStack_2470 = uStack_35d0;
        uStack_2468 = uStack_35c8;
        local_2440 = local_3680;
        uStack_2438 = uStack_3678;
        uStack_2430 = uStack_3670;
        uStack_2428 = uStack_3668;
        local_2420 = local_3600;
        uStack_2418 = uStack_35f8;
        uStack_2410 = uStack_35f0;
        uStack_2408 = uStack_35e8;
        local_23e0 = local_3660;
        uStack_23d8 = uStack_3658;
        uStack_23d0 = uStack_3650;
        uStack_23c8 = uStack_3648;
        local_23c0 = local_35e0;
        uStack_23b8 = uStack_35d8;
        uStack_23b0 = uStack_35d0;
        uStack_23a8 = uStack_35c8;
        local_2380 = local_3640;
        uStack_2378 = uStack_3638;
        uStack_2370 = uStack_3630;
        uStack_2368 = uStack_3628;
        local_2360 = local_3600;
        uStack_2358 = uStack_35f8;
        uStack_2350 = uStack_35f0;
        uStack_2348 = uStack_35e8;
        local_2320 = local_3620;
        uStack_2318 = uStack_3618;
        uStack_2310 = uStack_3610;
        uStack_2308 = uStack_3608;
        local_2300 = local_35e0;
        uStack_22f8 = uStack_35d8;
        uStack_22f0 = uStack_35d0;
        uStack_22e8 = uStack_35c8;
        local_ee0 = local_3620;
        uStack_ed8 = uStack_3618;
        uStack_ed0 = uStack_3610;
        uStack_ec8 = uStack_3608;
        local_ea0 = local_3640;
        uStack_e98 = uStack_3638;
        uStack_e90 = uStack_3630;
        uStack_e88 = uStack_3628;
        local_e60 = local_3660;
        uStack_e58 = uStack_3658;
        uStack_e50 = uStack_3650;
        uStack_e48 = uStack_3648;
        local_e20 = local_3680;
        uStack_e18 = uStack_3678;
        uStack_e10 = uStack_3670;
        uStack_e08 = uStack_3668;
        local_de0 = local_36a0;
        uStack_dd8 = uStack_3698;
        uStack_dd0 = uStack_3690;
        uStack_dc8 = uStack_3688;
        local_da0 = local_36c0;
        uStack_d98 = uStack_36b8;
        uStack_d90 = uStack_36b0;
        uStack_d88 = uStack_36a8;
        local_d60 = local_36e0;
        uStack_d58 = uStack_36d8;
        uStack_d50 = uStack_36d0;
        uStack_d48 = uStack_36c8;
        local_d20 = local_3700;
        uStack_d18 = uStack_36f8;
        uStack_d10 = uStack_36f0;
        uStack_d08 = uStack_36e8;
        local_4e0 = uVar6;
        uStack_4d8 = uVar7;
        uStack_4d0 = uVar8;
        uStack_4c8 = uVar9;
        fStack_4a4 = fStack_ea4;
        local_4a0 = uVar10;
        uStack_498 = uVar11;
        uStack_490 = uVar12;
        uStack_488 = uVar13;
        fStack_464 = fStack_e64;
        local_460 = uVar14;
        uStack_458 = uVar15;
        uStack_450 = uVar16;
        uStack_448 = uVar17;
        fStack_424 = fStack_e24;
        local_420 = uVar18;
        uStack_418 = uVar19;
        uStack_410 = uVar20;
        uStack_408 = uVar21;
        fStack_3e4 = fStack_de4;
        local_3e0 = uVar22;
        uStack_3d8 = uVar23;
        uStack_3d0 = uVar24;
        uStack_3c8 = uVar25;
        fStack_3a4 = fStack_da4;
        local_3a0 = uVar26;
        uStack_398 = uVar27;
        uStack_390 = uVar28;
        uStack_388 = uVar29;
        fStack_364 = fStack_d64;
        local_360 = uVar30;
        uStack_358 = uVar31;
        uStack_350 = uVar32;
        uStack_348 = uVar33;
        fStack_324 = fStack_d24;
        local_320 = uVar34;
        uStack_318 = uVar35;
        uStack_310 = uVar36;
        uStack_308 = uVar37;
        fStack_2e4 = fStack_ce4;
      }
      local_25e8 = local_3158;
      local_2620 = local_31a0;
      uStack_2618 = uStack_3198;
      uStack_2610 = uStack_3190;
      uStack_2608 = uStack_3188;
      *(undefined8 *)local_3158 = local_31a0;
      *(undefined8 *)(local_3158 + 2) = uStack_3198;
      *(undefined8 *)(local_3158 + 4) = uStack_3190;
      *(undefined8 *)(local_3158 + 6) = uStack_3188;
      local_2628 = local_3158 + 8;
      local_2660 = local_31c0;
      uStack_2658 = uStack_31b8;
      uStack_2650 = uStack_31b0;
      uStack_2648 = uStack_31a8;
      *(undefined8 *)local_2628 = local_31c0;
      *(undefined8 *)(local_3158 + 10) = uStack_31b8;
      *(undefined8 *)(local_3158 + 0xc) = uStack_31b0;
      *(undefined8 *)(local_3158 + 0xe) = uStack_31a8;
      local_2668 = local_3160;
      local_26a0 = local_31e0;
      uStack_2698 = uStack_31d8;
      uStack_2690 = uStack_31d0;
      uStack_2688 = uStack_31c8;
      *(undefined8 *)local_3160 = local_31e0;
      *(undefined8 *)(local_3160 + 2) = uStack_31d8;
      *(undefined8 *)(local_3160 + 4) = uStack_31d0;
      *(undefined8 *)(local_3160 + 6) = uStack_31c8;
      local_26a8 = local_3160 + 8;
      local_26e0 = local_3200;
      uStack_26d8 = uStack_31f8;
      uStack_26d0 = uStack_31f0;
      uStack_26c8 = uStack_31e8;
      *(undefined8 *)local_26a8 = local_3200;
      *(undefined8 *)(local_3160 + 10) = uStack_31f8;
      *(undefined8 *)(local_3160 + 0xc) = uStack_31f0;
      *(undefined8 *)(local_3160 + 0xe) = uStack_31e8;
      local_26e8 = local_3168;
      local_2720 = local_3220;
      uStack_2718 = uStack_3218;
      uStack_2710 = uStack_3210;
      uStack_2708 = uStack_3208;
      *(undefined8 *)local_3168 = local_3220;
      *(undefined8 *)(local_3168 + 2) = uStack_3218;
      *(undefined8 *)(local_3168 + 4) = uStack_3210;
      *(undefined8 *)(local_3168 + 6) = uStack_3208;
      local_2728 = local_3168 + 8;
      local_2760 = local_3240;
      uStack_2758 = uStack_3238;
      uStack_2750 = uStack_3230;
      uStack_2748 = uStack_3228;
      *(undefined8 *)local_2728 = local_3240;
      *(undefined8 *)(local_3168 + 10) = uStack_3238;
      *(undefined8 *)(local_3168 + 0xc) = uStack_3230;
      *(undefined8 *)(local_3168 + 0xe) = uStack_3228;
      local_2768 = local_3170;
      local_27a0 = local_3260;
      uStack_2798 = uStack_3258;
      uStack_2790 = uStack_3250;
      uStack_2788 = uStack_3248;
      *(undefined8 *)local_3170 = local_3260;
      *(undefined8 *)(local_3170 + 2) = uStack_3258;
      *(undefined8 *)(local_3170 + 4) = uStack_3250;
      *(undefined8 *)(local_3170 + 6) = uStack_3248;
      local_27a8 = (undefined1 (*) [32])(local_3170 + 8);
      local_27e0 = local_3280;
      uStack_27d8 = uStack_3278;
      uStack_27d0 = uStack_3270;
      uStack_27c8 = uStack_3268;
      auVar38._8_8_ = uStack_3278;
      auVar38._0_8_ = local_3280;
      auVar38._16_8_ = uStack_3270;
      auVar38._24_8_ = uStack_3268;
      *local_27a8 = auVar38;
    }
    Mat::~Mat((Mat *)0x347721);
    Mat::~Mat((Mat *)0x34772e);
    Mat::~Mat((Mat *)0x34773b);
    Mat::~Mat((Mat *)0x347748);
    Mat::~Mat((Mat *)0x347755);
    Mat::~Mat((Mat *)0x347762);
    Mat::~Mat((Mat *)0x34776f);
    Mat::~Mat((Mat *)0x34777c);
  }
  for (local_3704 = local_2efc; local_3704 < local_2bb0; local_3704 = local_3704 + 1) {
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    for (local_379c = 0; local_379c < local_2ef4; local_379c = local_379c + 1) {
      local_37a8 = Mat::row(&local_3750,local_379c);
      memset(local_37f0,0,0x40);
      for (local_37f4 = 0; local_37f4 + 3 < local_2ba4; local_37f4 = local_37f4 + 4) {
        Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
        _c = (int)((ulong)in_stack_ffffffffffffbe08 >> 0x20);
        in_stack_ffffffffffffbe30 = &local_3848;
        in_stack_ffffffffffffbe38 = (Mat *)Mat::row(in_stack_ffffffffffffbe30,local_379c);
        Mat::~Mat((Mat *)0x347907);
        local_3800 = in_stack_ffffffffffffbe38;
        Mat::channel(in_stack_ffffffffffffbe10,_c);
        in_stack_ffffffffffffbe20 = &local_3898;
        in_stack_ffffffffffffbe28 = Mat::row(in_stack_ffffffffffffbe20,local_379c);
        Mat::~Mat((Mat *)0x34795c);
        local_3850 = in_stack_ffffffffffffbe28;
        Mat::channel(in_stack_ffffffffffffbe10,_c);
        in_stack_ffffffffffffbe10 = &local_38e8;
        pfVar41 = Mat::row(in_stack_ffffffffffffbe10,local_379c);
        Mat::~Mat((Mat *)0x3479b2);
        local_38a0 = pfVar41;
        Mat::channel(in_stack_ffffffffffffbe10,_c);
        in_stack_ffffffffffffbe08 = (Mat *)Mat::row(&local_3938,local_379c);
        Mat::~Mat((Mat *)0x347a06);
        local_38f0 = in_stack_ffffffffffffbe08;
        local_3940 = Mat::row(&local_3798,local_37f4);
        local_3948 = Mat::row(&local_3798,local_37f4 + 1);
        local_3950 = Mat::row(&local_3798,local_37f4 + 2);
        local_3958 = Mat::row(&local_3798,local_37f4 + 3);
        for (local_395c = 0; local_395c < 0x10; local_395c = local_395c + 1) {
          local_37f0[local_395c] =
               *(float *)((long)&local_3800->data + (long)local_395c * 4) * local_3940[local_395c] +
               local_37f0[local_395c];
          local_37f0[local_395c] =
               local_3850[local_395c] * local_3948[local_395c] + local_37f0[local_395c];
          local_37f0[local_395c] =
               local_38a0[local_395c] * local_3950[local_395c] + local_37f0[local_395c];
          local_37f0[local_395c] =
               *(float *)((long)&local_38f0->data + (long)local_395c * 4) * local_3958[local_395c] +
               local_37f0[local_395c];
        }
      }
      for (; local_37f4 < local_2ba4; local_37f4 = local_37f4 + 1) {
        Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
        in_stack_ffffffffffffbe00 = Mat::row(&local_39b0,local_379c);
        Mat::~Mat((Mat *)0x347c7c);
        local_3968 = in_stack_ffffffffffffbe00;
        local_39b8 = Mat::row(&local_3798,local_37f4);
        for (local_39bc = 0; local_39bc < 0x10; local_39bc = local_39bc + 1) {
          local_37f0[local_39bc] =
               local_3968[local_39bc] * local_39b8[local_39bc] + local_37f0[local_39bc];
        }
      }
      for (local_39c0 = 0; local_39c0 < 0x10; local_39c0 = local_39c0 + 1) {
        local_37a8[local_39c0] = local_37f0[local_39c0];
      }
    }
    Mat::~Mat((Mat *)0x347d9c);
    Mat::~Mat((Mat *)0x347da9);
  }
  Mat::Mat(&local_3a08);
  Mat::operator=(in_stack_ffffffffffffbdf0,m);
  Mat::~Mat((Mat *)0x347e04);
  Mat::Mat(&local_3a50);
  if ((local_2ba8 == *(uint *)(local_2b80 + 0x2c)) && (local_2bac == *(uint *)(local_2b80 + 0x30)))
  {
    Mat::operator=(in_stack_ffffffffffffbdf0,m);
  }
  else {
    Mat::create(in_stack_ffffffffffffbe08,(int)((ulong)in_stack_ffffffffffffbe00 >> 0x20),
                (int)in_stack_ffffffffffffbe00,in_stack_ffffffffffffbdfc,
                (size_t)in_stack_ffffffffffffbdf0,(Allocator *)m);
  }
  local_3a54 = (int)local_2ba8 / 2 << 2;
  local_3a58 = (int)local_2bac / 2 << 2;
  local_3a5c = local_3a58 / 4;
  local_3a60 = local_3a54 / 4;
  for (local_3a64 = 0; local_3a64 < local_2bb0; local_3a64 = local_3a64 + 1) {
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    Mat::channel(in_stack_ffffffffffffbe10,(int)((ulong)in_stack_ffffffffffffbe08 >> 0x20));
    if (local_2c58 == (float *)0x0) {
      local_3afc = 0.0;
    }
    else {
      local_3afc = local_2c58[local_3a64];
    }
    for (local_3b00 = 0; local_3b00 < local_3a5c; local_3b00 = local_3b00 + 1) {
      local_3b08 = Mat::row(&local_3af8,local_3b00 << 1);
      local_3b10 = Mat::row(&local_3af8,local_3b00 * 2 + 1);
      for (local_3b14 = 0; local_3b14 < local_3a60; local_3b14 = local_3b14 + 1) {
        local_3b20 = Mat::row(&local_3ab0,local_3b00 * local_3a60 + local_3b14);
        for (local_3bb4 = 0; local_3bb4 < 4; local_3bb4 = local_3bb4 + 1) {
          afStack_3b30[local_3bb4] = local_3b20[local_3bb4];
          afStack_3b40[local_3bb4] = local_3b20[local_3bb4 + 4];
          afStack_3b50[local_3bb4] = local_3b20[local_3bb4 + 8];
          afStack_3b60[local_3bb4] = local_3b20[local_3bb4 + 0xc];
        }
        for (local_3bb8 = 0; local_3bb8 < 4; local_3bb8 = local_3bb8 + 1) {
          local_3b70[local_3bb8] =
               afStack_3b30[local_3bb8] + afStack_3b40[local_3bb8] + afStack_3b50[local_3bb8];
          local_3bb0[(long)local_3bb8 + 0xc] =
               (afStack_3b40[local_3bb8] - afStack_3b50[local_3bb8]) + afStack_3b60[local_3bb8];
        }
        local_3b88 = local_3b70[0];
        local_3b84 = local_3b80[0];
        local_3b90 = local_3b70[1];
        local_3b8c = local_3b80[1];
        local_3b98 = local_3b70[2];
        local_3b94 = local_3b80[2];
        local_3ba0 = local_3b70[3];
        local_3b9c = local_3b80[3];
        for (local_3bbc = 0; local_3bbc < 2; local_3bbc = local_3bbc + 1) {
          local_3bb0[(long)local_3bbc + 2] =
               local_3bb0[(long)local_3bbc + 10] + local_3bb0[(long)local_3bbc + 8] +
               local_3bb0[(long)local_3bbc + 6] + local_3afc;
          local_3bb0[local_3bbc] =
               (local_3bb0[(long)local_3bbc + 8] - local_3bb0[(long)local_3bbc + 6]) +
               local_3bb0[(long)local_3bbc + 4] + local_3afc;
        }
        *local_3b08 = local_3bb0[2];
        local_3b08[1] = local_3bb0[3];
        *local_3b10 = local_3bb0[0];
        local_3b10[1] = local_3bb0[1];
        local_3b08 = local_3b08 + 2;
        local_3b10 = local_3b10 + 2;
      }
    }
    Mat::~Mat((Mat *)0x348434);
    Mat::~Mat((Mat *)0x348441);
  }
  copy_cut_border(in_stack_ffffffffffffbe38,in_stack_ffffffffffffbe30,
                  (int)((ulong)in_stack_ffffffffffffbe28 >> 0x20),(int)in_stack_ffffffffffffbe28,
                  (int)((ulong)in_stack_ffffffffffffbe20 >> 0x20),(int)in_stack_ffffffffffffbe20,
                  (Option *)CONCAT44(in_stack_ffffffffffffbe4c,in_stack_ffffffffffffbe48));
  Mat::~Mat((Mat *)0x3484a9);
  Mat::~Mat((Mat *)0x3484b6);
  Mat::~Mat((Mat *)0x3484c3);
  Mat::~Mat((Mat *)0x3484d0);
  return;
}

Assistant:

static void conv3x3s1_winograd23_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    const float* bias = _bias;

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4 * 4, tiles, inch, 4u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < inch; q++)
        {
            const float* img = bottom_blob_bordered.channel(q);
            float* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const float* r0 = img + w * j * 2;
                const float* r1 = r0 + w;
                const float* r2 = r1 + w;
                const float* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
#if __AVX__
                    __m128 _d0, _d1, _d2, _d3;
                    __m128 _w0, _w1, _w2, _w3;

                    // load
                    _d0 = _mm_loadu_ps(r0);
                    _d1 = _mm_loadu_ps(r1);
                    _d2 = _mm_loadu_ps(r2);
                    _d3 = _mm_loadu_ps(r3);

                    // w = B_t * d
                    _w0 = _mm_sub_ps(_d0, _d2);
                    _w1 = _mm_add_ps(_d1, _d2);
                    _w2 = _mm_sub_ps(_d2, _d1);
                    _w3 = _mm_sub_ps(_d3, _d1);

                    // transpose d to d_t
                    _MM_TRANSPOSE4_PS(_w0, _w1, _w2, _w3);

                    // d = B_t * d_t
                    _d0 = _mm_sub_ps(_w0, _w2);
                    _d1 = _mm_add_ps(_w1, _w2);
                    _d2 = _mm_sub_ps(_w2, _w1);
                    _d3 = _mm_sub_ps(_w3, _w1);

                    // save to out_tm
                    _mm_storeu_ps(out_tm0, _d0);
                    _mm_storeu_ps(out_tm0 + 4, _d1);
                    _mm_storeu_ps(out_tm0 + 8, _d2);
                    _mm_storeu_ps(out_tm0 + 12, _d3);
#else
                    float d0[4], d1[4], d2[4], d3[4];
                    float w0[4], w1[4], w2[4], w3[4];
                    float t0[4], t1[4], t2[4], t3[4];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0] = w0[0];
                        t1[0] = w0[1];
                        t2[0] = w0[2];
                        t3[0] = w0[3];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t2[1] = w1[2];
                        t3[1] = w1[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                    }
                    // d = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n] = d0[n];
                        out_tm0[n + 4] = d1[n];
                        out_tm0[n + 8] = d2[n];
                        out_tm0[n + 12] = d3[n];
                    }
#endif
                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p + 1);
            Mat out2_tm = top_blob_tm.channel(p + 2);
            Mat out3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p + 1);
            const Mat kernel2_tm = kernel_tm.channel(p + 2);
            const Mat kernel3_tm = kernel_tm.channel(p + 3);

            for (int i = 0; i < tiles; i++)
            {
                float* output0_tm = out0_tm.row(i);
                float* output1_tm = out1_tm.row(i);
                float* output2_tm = out2_tm.row(i);
                float* output3_tm = out3_tm.row(i);

#if __AVX__
                float zero_val = 0.f;

                __m256 _sum0 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum0n = _mm256_broadcast_ss(&zero_val);
                __m256 _sum1 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum1n = _mm256_broadcast_ss(&zero_val);
                __m256 _sum2 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum2n = _mm256_broadcast_ss(&zero_val);
                __m256 _sum3 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum3n = _mm256_broadcast_ss(&zero_val);

                int q = 0;

                for (; q + 3 < inch; q += 4)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* r1 = bottom_blob_tm.channel(q + 1).row(i);
                    const float* r2 = bottom_blob_tm.channel(q + 2).row(i);
                    const float* r3 = bottom_blob_tm.channel(q + 3).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    __m256 _r0 = _mm256_loadu_ps(r0);
                    __m256 _r0n = _mm256_loadu_ps(r0 + 8);
                    // k0
                    __m256 _k0 = _mm256_loadu_ps(k0);
                    __m256 _k0n = _mm256_loadu_ps(k0 + 8);
                    __m256 _k1 = _mm256_loadu_ps(k1);
                    __m256 _k1n = _mm256_loadu_ps(k1 + 8);
                    __m256 _k2 = _mm256_loadu_ps(k2);
                    __m256 _k2n = _mm256_loadu_ps(k2 + 8);
                    __m256 _k3 = _mm256_loadu_ps(k3);
                    __m256 _k3n = _mm256_loadu_ps(k3 + 8);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);

                    // k1
                    _r0 = _mm256_loadu_ps(r1);
                    _r0n = _mm256_loadu_ps(r1 + 8);
                    _k0 = _mm256_loadu_ps(k0 + 16);
                    _k0n = _mm256_loadu_ps(k0 + 24);
                    _k1 = _mm256_loadu_ps(k1 + 16);
                    _k1n = _mm256_loadu_ps(k1 + 24);
                    _k2 = _mm256_loadu_ps(k2 + 16);
                    _k2n = _mm256_loadu_ps(k2 + 24);
                    _k3 = _mm256_loadu_ps(k3 + 16);
                    _k3n = _mm256_loadu_ps(k3 + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                    // k2
                    _r0 = _mm256_loadu_ps(r2);
                    _r0n = _mm256_loadu_ps(r2 + 8);
                    _k0 = _mm256_loadu_ps(k0 + 32);
                    _k0n = _mm256_loadu_ps(k0 + 40);
                    _k1 = _mm256_loadu_ps(k1 + 32);
                    _k1n = _mm256_loadu_ps(k1 + 40);
                    _k2 = _mm256_loadu_ps(k2 + 32);
                    _k2n = _mm256_loadu_ps(k2 + 40);
                    _k3 = _mm256_loadu_ps(k3 + 32);
                    _k3n = _mm256_loadu_ps(k3 + 40);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                    // k3
                    _r0 = _mm256_loadu_ps(r3);
                    _r0n = _mm256_loadu_ps(r3 + 8);
                    _k0 = _mm256_loadu_ps(k0 + 48);
                    _k0n = _mm256_loadu_ps(k0 + 56);
                    _k1 = _mm256_loadu_ps(k1 + 48);
                    _k1n = _mm256_loadu_ps(k1 + 56);
                    _k2 = _mm256_loadu_ps(k2 + 48);
                    _k2n = _mm256_loadu_ps(k2 + 56);
                    _k3 = _mm256_loadu_ps(k3 + 48);
                    _k3n = _mm256_loadu_ps(k3 + 56);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                }

                for (; q < inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    __m256 _r0 = _mm256_loadu_ps(r0);
                    __m256 _r0n = _mm256_loadu_ps(r0 + 8);
                    __m256 _k0 = _mm256_loadu_ps(k0);
                    __m256 _k0n = _mm256_loadu_ps(k0 + 8);
                    __m256 _k1 = _mm256_loadu_ps(k1);
                    __m256 _k1n = _mm256_loadu_ps(k1 + 8);
                    __m256 _k2 = _mm256_loadu_ps(k2);
                    __m256 _k2n = _mm256_loadu_ps(k2 + 8);
                    __m256 _k3 = _mm256_loadu_ps(k3);
                    __m256 _k3n = _mm256_loadu_ps(k3 + 8);

                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                }

                _mm256_storeu_ps(output0_tm, _sum0);
                _mm256_storeu_ps(output0_tm + 8, _sum0n);
                _mm256_storeu_ps(output1_tm, _sum1);
                _mm256_storeu_ps(output1_tm + 8, _sum1n);
                _mm256_storeu_ps(output2_tm, _sum2);
                _mm256_storeu_ps(output2_tm + 8, _sum2n);
                _mm256_storeu_ps(output3_tm, _sum3);
                _mm256_storeu_ps(output3_tm + 8, _sum3n);
#else
                float sum0[16] = {0.0f};
                float sum1[16] = {0.0f};
                float sum2[16] = {0.0f};
                float sum3[16] = {0.0f};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* r1 = bottom_blob_tm.channel(q + 1).row(i);
                    const float* r2 = bottom_blob_tm.channel(q + 2).row(i);
                    const float* r3 = bottom_blob_tm.channel(q + 3).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q < inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                        sum1[n] += r0[n] * k1[n];
                        sum2[n] += r0[n] * k2[n];
                        sum3[n] += r0[n] * k3[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
#endif
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i = 0; i < tiles; i++)
            {
                float* output0_tm = out0_tm.row(i);

                float sum0[16] = {0.0f};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* r1 = bottom_blob_tm.channel(q + 1).row(i);
                    const float* r2 = bottom_blob_tm.channel(q + 2).row(i);
                    const float* r3 = bottom_blob_tm.channel(q + 3).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel0_tm.row(q + 1);
                    const float* k2 = kernel0_tm.row(q + 2);
                    const float* k3 = kernel0_tm.row(q + 3);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                        sum0[n] += r1[n] * k1[n];
                        sum0[n] += r2[n] * k2[n];
                        sum0[n] += r3[n] * k3[n];
                    }
                }

                for (; q < inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* k0 = kernel0_tm.row(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    }
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // };

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            const float bias0 = bias ? bias[p] : 0.f;

            for (int j = 0; j < nColBlocks; j++)
            {
                float* outRow0 = out.row(j * 2);
                float* outRow1 = out.row(j * 2 + 1);

                for (int i = 0; i < nRowBlocks; i++)
                {
                    float* out_tile = out_tm.row(j * nRowBlocks + i);

                    float s0[4], s1[4], s2[4], s3[4];
                    float w0[4], w1[4];
                    float d0[2], d1[2], d2[2], d3[2];
                    float o0[2], o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n + 4];
                        s2[n] = out_tile[n + 8];
                        s3[n] = out_tile[n + 12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0];
                        d0[1] = w1[0];
                        d1[0] = w0[1];
                        d1[1] = w1[1];
                        d2[0] = w0[2];
                        d2[1] = w1[2];
                        d3[0] = w0[3];
                        d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n] + bias0;
                        o1[n] = d1[n] - d2[n] + d3[n] + bias0;
                    }
                    // save to top blob tm
                    outRow0[0] = o0[0];
                    outRow0[1] = o0[1];
                    outRow1[0] = o1[0];
                    outRow1[1] = o1[1];

                    outRow0 += 2;
                    outRow1 += 2;
                }
            }
        }
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}